

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::ELU_x86_avx512::forward_inplace(ELU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [24];
  undefined1 auVar65 [40];
  undefined1 auVar66 [48];
  undefined1 auVar67 [56];
  undefined1 auVar68 [24];
  long *in_RSI;
  long in_RDI;
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  float fVar76;
  float fVar77;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  __m128 _p_2;
  __m128 _alpha128;
  __m256 _p_1;
  __m256 _alpha256;
  __m512 _p;
  __m512 _alpha512;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m512 neg;
  __m512 pos;
  __m256 neg_1;
  __m256 pos_1;
  __m128 neg_2;
  __m128 pos_2;
  __m512 pow2n;
  __m512 y;
  __mmask16 mask;
  __m512 one;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m256 pow2n_1;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  v4sf pow2n_2;
  v4sf y_2;
  v4sf mask_2;
  v4sf one_2;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_2;
  int local_2750;
  undefined8 local_2740;
  undefined8 local_2738;
  undefined8 local_2730;
  undefined4 local_2728;
  long local_2720;
  undefined4 local_2718;
  undefined4 local_2714;
  undefined4 local_2710;
  undefined4 local_270c;
  undefined4 local_2708;
  undefined8 local_2700;
  undefined1 (*local_26f8) [64];
  int local_26ec;
  int local_26e8;
  int local_26e4;
  int local_26e0;
  int local_26dc;
  int local_26d8;
  int local_26d4;
  long *local_26c8;
  undefined1 local_26b5;
  int local_26b4;
  undefined8 *local_26a8;
  undefined8 *local_26a0;
  undefined8 *local_2690;
  undefined1 local_2680 [64];
  uint local_260c;
  undefined1 (*local_2608) [64];
  undefined1 local_2600 [64];
  undefined1 (*local_2588) [64];
  undefined1 local_2580 [64];
  undefined1 local_2540 [64];
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 uStack_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 uStack_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [64];
  undefined4 local_2410;
  uint local_240c;
  undefined1 (*local_2408) [64];
  float local_2400;
  float fStack_23fc;
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  undefined1 (*local_23c8) [64];
  undefined1 local_23c0 [32];
  undefined1 local_23a0 [32];
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined4 local_2334;
  float local_2330;
  float fStack_232c;
  float fStack_2328;
  float fStack_2324;
  float local_231c;
  undefined1 (*local_2318) [64];
  float local_2310;
  float fStack_230c;
  float fStack_2308;
  float fStack_2304;
  undefined1 (*local_22f8) [64];
  undefined1 local_22f0 [16];
  undefined1 local_22e0 [16];
  undefined8 local_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined4 local_22b0;
  undefined4 uStack_22ac;
  undefined4 uStack_22a8;
  undefined4 uStack_22a4;
  undefined4 local_2294;
  long local_2290;
  undefined4 local_2284;
  long local_2280;
  undefined1 (*local_2278) [64];
  undefined4 local_226c;
  int local_2268;
  int local_2264;
  undefined8 *local_2260;
  undefined4 local_2254;
  long local_2250;
  undefined8 *local_2230;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 uStack_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 uStack_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 uStack_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 uStack_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 uStack_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 uStack_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 uStack_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined1 local_2000 [64];
  undefined1 local_1fc0 [8];
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  ushort local_1f42;
  float local_1f40 [2];
  float afStack_1f38 [2];
  float afStack_1f30 [2];
  float afStack_1f28 [2];
  float afStack_1f20 [2];
  float afStack_1f18 [2];
  float afStack_1f10 [2];
  float afStack_1f08 [2];
  undefined1 local_1f00 [64];
  undefined1 local_1ec0 [16];
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 uStack_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined1 local_1e80 [64];
  undefined1 local_1e40 [64];
  float local_1e00 [2];
  float afStack_1df8 [2];
  float afStack_1df0 [2];
  float afStack_1de8 [2];
  float afStack_1de0 [2];
  float afStack_1dd8 [2];
  float afStack_1dd0 [2];
  float afStack_1dc8 [2];
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 uStack_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 uStack_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  float local_1d40 [2];
  float afStack_1d38 [2];
  float afStack_1d30 [2];
  float afStack_1d28 [2];
  float afStack_1d20 [2];
  float afStack_1d18 [2];
  float afStack_1d10 [2];
  float afStack_1d08 [2];
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 uStack_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  float local_1cc0 [2];
  float afStack_1cb8 [2];
  float afStack_1cb0 [2];
  float afStack_1ca8 [2];
  float afStack_1ca0 [2];
  float afStack_1c98 [2];
  float afStack_1c90 [2];
  float afStack_1c88 [2];
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 uStack_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined1 local_1c40 [64];
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 uStack_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 uStack_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 uStack_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 uStack_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 uStack_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 uStack_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 uStack_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 uStack_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 uStack_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 uStack_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  float local_1980 [2];
  float afStack_1978 [2];
  float afStack_1970 [2];
  float afStack_1968 [2];
  float afStack_1960 [2];
  float afStack_1958 [2];
  float afStack_1950 [2];
  float afStack_1948 [2];
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 uStack_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 uStack_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  float local_18c0 [2];
  float afStack_18b8 [2];
  float afStack_18b0 [2];
  float afStack_18a8 [2];
  float afStack_18a0 [2];
  float afStack_1898 [2];
  float afStack_1890 [2];
  float afStack_1888 [2];
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 uStack_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 uStack_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  float local_1800 [2];
  float afStack_17f8 [2];
  float afStack_17f0 [2];
  float afStack_17e8 [2];
  float afStack_17e0 [2];
  float afStack_17d8 [2];
  float afStack_17d0 [2];
  float afStack_17c8 [2];
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 uStack_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 uStack_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  float local_1740 [2];
  float afStack_1738 [2];
  float afStack_1730 [2];
  float afStack_1728 [2];
  float afStack_1720 [2];
  float afStack_1718 [2];
  float afStack_1710 [2];
  float afStack_1708 [2];
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 uStack_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 uStack_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  float local_1680 [2];
  float afStack_1678 [2];
  float afStack_1670 [2];
  float afStack_1668 [2];
  float afStack_1660 [2];
  float afStack_1658 [2];
  float afStack_1650 [2];
  float afStack_1648 [2];
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 uStack_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  float local_1600 [2];
  float afStack_15f8 [2];
  float afStack_15f0 [2];
  float afStack_15e8 [2];
  float afStack_15e0 [2];
  float afStack_15d8 [2];
  float afStack_15d0 [2];
  float afStack_15c8 [2];
  float local_15c0 [2];
  float afStack_15b8 [2];
  float afStack_15b0 [2];
  float afStack_15a8 [2];
  float afStack_15a0 [2];
  float afStack_1598 [2];
  float afStack_1590 [2];
  float afStack_1588 [2];
  float local_1580 [2];
  float afStack_1578 [2];
  float afStack_1570 [2];
  float afStack_1568 [2];
  float afStack_1560 [2];
  float afStack_1558 [2];
  float afStack_1550 [2];
  float afStack_1548 [2];
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 uStack_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  float local_1500 [2];
  float afStack_14f8 [2];
  float afStack_14f0 [2];
  float afStack_14e8 [2];
  float afStack_14e0 [2];
  float afStack_14d8 [2];
  float afStack_14d0 [2];
  float afStack_14c8 [2];
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 uStack_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  ushort local_1442;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 uStack_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  float local_1400 [2];
  float afStack_13f8 [2];
  float afStack_13f0 [2];
  float afStack_13e8 [2];
  float afStack_13e0 [2];
  float afStack_13d8 [2];
  float afStack_13d0 [2];
  float afStack_13c8 [2];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 uStack_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 uStack_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  float local_1340 [2];
  float afStack_1338 [2];
  float afStack_1330 [2];
  float afStack_1328 [2];
  float afStack_1320 [2];
  float afStack_1318 [2];
  float afStack_1310 [2];
  float afStack_1308 [2];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 uStack_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 uStack_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  float local_1280 [2];
  float afStack_1278 [2];
  float afStack_1270 [2];
  float afStack_1268 [2];
  float afStack_1260 [2];
  float afStack_1258 [2];
  float afStack_1250 [2];
  float afStack_1248 [2];
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 uStack_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 uStack_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined1 local_11c0 [64];
  undefined1 local_1180 [64];
  undefined4 local_1104;
  undefined1 local_1100 [64];
  undefined1 local_10c0 [64];
  undefined1 local_1080 [64];
  undefined1 local_1020 [32];
  undefined4 local_1000;
  undefined4 local_ffc;
  undefined4 local_ff8;
  undefined4 local_ff4;
  undefined4 local_ff0;
  undefined4 local_fec;
  undefined4 local_fe8;
  undefined4 local_fe4;
  undefined1 local_fe0 [32];
  uint local_fc0;
  uint local_fbc;
  uint local_fb8;
  uint local_fb4;
  uint local_fb0;
  uint local_fac;
  uint local_fa8;
  uint local_fa4;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined1 local_e80 [8];
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined1 local_e60 [32];
  undefined4 local_e40;
  undefined4 uStack_e3c;
  undefined4 uStack_e38;
  undefined4 uStack_e34;
  undefined4 uStack_e30;
  undefined4 uStack_e2c;
  undefined4 uStack_e28;
  undefined4 uStack_e24;
  undefined1 local_e20 [32];
  undefined1 local_e00 [32];
  undefined1 local_de0 [8];
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined1 local_dc0 [32];
  undefined4 local_da0;
  undefined4 uStack_d9c;
  undefined4 uStack_d98;
  undefined4 uStack_d94;
  undefined4 uStack_d90;
  undefined4 uStack_d8c;
  undefined4 uStack_d88;
  undefined4 uStack_d84;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined4 local_d40;
  undefined4 uStack_d3c;
  undefined4 uStack_d38;
  undefined4 uStack_d34;
  undefined4 uStack_d30;
  undefined4 uStack_d2c;
  undefined4 uStack_d28;
  undefined4 uStack_d24;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined1 local_c60 [8];
  float fStack_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float fStack_c48;
  float fStack_c44;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined1 *local_b68;
  undefined1 *local_b60;
  undefined1 *local_b58;
  float *local_b50;
  undefined1 *local_b48;
  undefined1 *local_b40;
  float *local_b38;
  undefined1 *local_b30;
  undefined1 *local_b28;
  float *local_b20;
  undefined1 *local_b18;
  undefined1 *local_b10;
  float *local_b08;
  undefined1 *local_b00;
  undefined1 *local_af8;
  float *local_af0;
  undefined1 *local_ae8;
  undefined1 *local_ae0;
  float *local_ad8;
  float *local_ad0;
  undefined1 *local_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined1 *local_a70;
  float *local_a68;
  undefined1 *local_a60;
  undefined1 *local_a58;
  float *local_a50;
  undefined1 *local_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined4 local_9c4;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  float local_980 [2];
  float afStack_978 [2];
  float afStack_970 [2];
  float afStack_968 [2];
  float local_960 [2];
  float afStack_958 [2];
  float afStack_950 [2];
  float afStack_948 [2];
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  float local_920 [2];
  float afStack_918 [2];
  float afStack_910 [2];
  float afStack_908 [2];
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  float local_8c0 [2];
  float afStack_8b8 [2];
  float afStack_8b0 [2];
  float afStack_8a8 [2];
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  float local_860 [2];
  float afStack_858 [2];
  float afStack_850 [2];
  float afStack_848 [2];
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  float local_800 [2];
  float afStack_7f8 [2];
  float afStack_7f0 [2];
  float afStack_7e8 [2];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  float local_7a0 [2];
  float afStack_798 [2];
  float afStack_790 [2];
  float afStack_788 [2];
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  float local_6c0 [2];
  float afStack_6b8 [2];
  float afStack_6b0 [2];
  float afStack_6a8 [2];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_660 [2];
  float afStack_658 [2];
  float afStack_650 [2];
  float afStack_648 [2];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined4 local_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined1 local_510 [8];
  undefined8 uStack_508;
  undefined1 local_500 [16];
  undefined4 local_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [8];
  undefined8 uStack_4c8;
  undefined1 local_4c0 [8];
  undefined8 uStack_4b8;
  undefined1 local_4b0 [16];
  undefined4 local_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined1 local_480 [16];
  undefined4 local_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  float local_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined4 local_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined1 *local_2e0;
  float *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  float *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  float *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  float *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  float *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  float *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  float *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined4 local_1f4;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1c0 [2];
  float afStack_1b8 [2];
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  float local_190 [2];
  float afStack_188 [2];
  undefined8 local_180;
  undefined8 uStack_178;
  float local_170 [2];
  float afStack_168 [2];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  float local_140 [2];
  float afStack_138 [2];
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  float local_110 [2];
  float afStack_108 [2];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  float local_e0 [2];
  float afStack_d8 [2];
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  float local_b0 [2];
  float afStack_a8 [2];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_26d4 = *(int *)((long)in_RSI + 0x2c);
  local_26d8 = (int)in_RSI[6];
  local_26dc = *(int *)((long)in_RSI + 0x34);
  local_26e0 = (int)in_RSI[7];
  local_26e4 = (int)in_RSI[3];
  local_26e8 = local_26d4 * local_26d8 * local_26dc * local_26e4;
  local_26c8 = in_RSI;
  for (local_26ec = 0; local_26ec < local_26e0; local_26ec = local_26ec + 1) {
    local_26a8 = &local_2740;
    local_2264 = *(int *)((long)local_26c8 + 0x2c);
    local_2268 = (int)local_26c8[6];
    local_226c = *(undefined4 *)((long)local_26c8 + 0x34);
    local_2278 = (undefined1 (*) [64])
                 (*local_26c8 + local_26c8[8] * (long)local_26ec * local_26c8[2]);
    local_2280 = local_26c8[2];
    local_2284 = (undefined4)local_26c8[3];
    local_2290 = local_26c8[4];
    local_2260 = &local_2740;
    local_2250 = (long)local_2264 * (long)local_2268 * local_2280;
    local_26a0 = &local_2740;
    local_2690 = &local_2740;
    local_2254 = 0x10;
    local_26b4 = local_26ec;
    local_26b5 = 1;
    local_2740 = 0;
    local_2730 = 0;
    local_2728 = 0;
    local_2718 = 0;
    local_2714 = 0;
    local_2710 = 0;
    local_270c = 0;
    local_2708 = 0;
    local_2700 = 0;
    local_2738 = 0;
    local_2750 = 0;
    local_260c = *(uint *)(in_RDI + 0xd0);
    local_2680 = vbroadcastss_avx512f(ZEXT416(local_260c));
    local_26f8 = local_2278;
    for (; local_2750 + 0xf < local_26e8; local_2750 = local_2750 + 0x10) {
      local_2608 = local_26f8;
      local_24c0 = *(undefined8 *)*local_26f8;
      uStack_24b8 = *(undefined8 *)(*local_26f8 + 8);
      uStack_24b0 = *(undefined8 *)(*local_26f8 + 0x10);
      uStack_24a8 = *(undefined8 *)(*local_26f8 + 0x18);
      uStack_24a0 = *(undefined8 *)(*local_26f8 + 0x20);
      uStack_2498 = *(undefined8 *)(*local_26f8 + 0x28);
      uStack_2490 = *(undefined8 *)(*local_26f8 + 0x30);
      uStack_2488 = *(undefined8 *)(*local_26f8 + 0x38);
      local_2588 = local_26f8;
      local_2500 = local_2680._0_8_;
      uStack_24f8 = local_2680._8_8_;
      uStack_24f0 = local_2680._16_8_;
      uStack_24e8 = local_2680._24_8_;
      uStack_24e0 = local_2680._32_8_;
      uStack_24d8 = local_2680._40_8_;
      uStack_24d0 = local_2680._48_8_;
      uStack_24c8 = local_2680._56_8_;
      local_2140 = 0;
      uStack_2138 = 0;
      uStack_2130 = 0;
      uStack_2128 = 0;
      uStack_2120 = 0;
      uStack_2118 = 0;
      uStack_2110 = 0;
      uStack_2108 = 0;
      local_21c0 = 0;
      uStack_21b8 = 0;
      uStack_21b0 = 0;
      uStack_21a8 = 0;
      uStack_21a0 = 0;
      uStack_2198 = 0;
      uStack_2190 = 0;
      uStack_2188 = 0;
      local_2540 = vmaxps_avx512f(ZEXT1664(ZEXT816(0)),*local_26f8);
      local_2180 = 0;
      uStack_2178 = 0;
      uStack_2170 = 0;
      uStack_2168 = 0;
      uStack_2160 = 0;
      uStack_2158 = 0;
      uStack_2150 = 0;
      uStack_2148 = 0;
      local_20c0 = 0;
      uStack_20b8 = 0;
      uStack_20b0 = 0;
      uStack_20a8 = 0;
      uStack_20a0 = 0;
      uStack_2098 = 0;
      uStack_2090 = 0;
      uStack_2088 = 0;
      auVar69 = vminps_avx512f(ZEXT1664(ZEXT816(0)),*local_26f8);
      local_2580._0_8_ = auVar69._0_8_;
      local_2580._8_8_ = auVar69._8_8_;
      local_2580._16_8_ = auVar69._16_8_;
      local_2580._24_8_ = auVar69._24_8_;
      local_2580._32_8_ = auVar69._32_8_;
      local_2580._40_8_ = auVar69._40_8_;
      local_2580._48_8_ = auVar69._48_8_;
      local_2580._56_8_ = auVar69._56_8_;
      local_1d80 = 0;
      uStack_1d78 = 0;
      uStack_1d70 = 0;
      uStack_1d68 = 0;
      uStack_1d60 = 0;
      uStack_1d58 = 0;
      uStack_1d50 = 0;
      uStack_1d48 = 0;
      local_1f40[0] = 1.0;
      local_1f40[1] = 1.0;
      afStack_1f38[0] = 1.0;
      afStack_1f38[1] = 1.0;
      afStack_1f30[0] = 1.0;
      afStack_1f30[1] = 1.0;
      afStack_1f28[0] = 1.0;
      afStack_1f28[1] = 1.0;
      afStack_1f20[0] = 1.0;
      afStack_1f20[1] = 1.0;
      afStack_1f18[0] = 1.0;
      afStack_1f18[1] = 1.0;
      afStack_1f10[0] = 1.0;
      afStack_1f10[1] = 1.0;
      afStack_1f08[0] = 1.0;
      afStack_1f08[1] = 1.0;
      local_1d00 = local_2580._0_8_;
      uStack_1cf8 = local_2580._8_8_;
      uStack_1cf0 = local_2580._16_8_;
      uStack_1ce8 = local_2580._24_8_;
      uStack_1ce0 = local_2580._32_8_;
      uStack_1cd8 = local_2580._40_8_;
      uStack_1cd0 = local_2580._48_8_;
      uStack_1cc8 = local_2580._56_8_;
      local_1d40[0] = 88.37626;
      local_1d40[1] = 88.37626;
      afStack_1d38[0] = 88.37626;
      afStack_1d38[1] = 88.37626;
      afStack_1d30[0] = 88.37626;
      afStack_1d30[1] = 88.37626;
      afStack_1d28[0] = 88.37626;
      afStack_1d28[1] = 88.37626;
      afStack_1d20[0] = 88.37626;
      afStack_1d20[1] = 88.37626;
      afStack_1d18[0] = 88.37626;
      afStack_1d18[1] = 88.37626;
      afStack_1d10[0] = 88.37626;
      afStack_1d10[1] = 88.37626;
      afStack_1d08[0] = 88.37626;
      afStack_1d08[1] = 88.37626;
      auVar70._8_4_ = 88.37626;
      auVar70._12_4_ = 88.37626;
      auVar70._0_4_ = 88.37626;
      auVar70._4_4_ = 88.37626;
      auVar70._16_4_ = 88.37626;
      auVar70._20_4_ = 88.37626;
      auVar70._24_4_ = 88.37626;
      auVar70._28_4_ = 88.37626;
      auVar70._32_4_ = 88.37626;
      auVar70._36_4_ = 88.37626;
      auVar70._40_4_ = 88.37626;
      auVar70._44_4_ = 88.37626;
      auVar70._48_4_ = 88.37626;
      auVar70._52_4_ = 88.37626;
      auVar70._56_4_ = 88.37626;
      auVar70._60_4_ = 88.37626;
      auVar70 = vminps_avx512f(auVar69,auVar70);
      local_1e40._0_8_ = auVar70._0_8_;
      local_1dc0 = local_1e40._0_8_;
      local_1e40._8_8_ = auVar70._8_8_;
      uStack_1db8 = local_1e40._8_8_;
      local_1e40._16_8_ = auVar70._16_8_;
      uStack_1db0 = local_1e40._16_8_;
      local_1e40._24_8_ = auVar70._24_8_;
      uStack_1da8 = local_1e40._24_8_;
      local_1e40._32_8_ = auVar70._32_8_;
      uStack_1da0 = local_1e40._32_8_;
      local_1e40._40_8_ = auVar70._40_8_;
      uStack_1d98 = local_1e40._40_8_;
      local_1e40._48_8_ = auVar70._48_8_;
      uStack_1d90 = local_1e40._48_8_;
      local_1e40._56_8_ = auVar70._56_8_;
      uStack_1d88 = local_1e40._56_8_;
      local_1e00[0] = -88.37626;
      local_1e00[1] = -88.37626;
      afStack_1df8[0] = -88.37626;
      afStack_1df8[1] = -88.37626;
      afStack_1df0[0] = -88.37626;
      afStack_1df0[1] = -88.37626;
      afStack_1de8[0] = -88.37626;
      afStack_1de8[1] = -88.37626;
      afStack_1de0[0] = -88.37626;
      afStack_1de0[1] = -88.37626;
      afStack_1dd8[0] = -88.37626;
      afStack_1dd8[1] = -88.37626;
      afStack_1dd0[0] = -88.37626;
      afStack_1dd0[1] = -88.37626;
      afStack_1dc8[0] = -88.37626;
      afStack_1dc8[1] = -88.37626;
      auVar69._8_4_ = -88.37626;
      auVar69._12_4_ = -88.37626;
      auVar69._0_4_ = -88.37626;
      auVar69._4_4_ = -88.37626;
      auVar69._16_4_ = -88.37626;
      auVar69._20_4_ = -88.37626;
      auVar69._24_4_ = -88.37626;
      auVar69._28_4_ = -88.37626;
      auVar69._32_4_ = -88.37626;
      auVar69._36_4_ = -88.37626;
      auVar69._40_4_ = -88.37626;
      auVar69._44_4_ = -88.37626;
      auVar69._48_4_ = -88.37626;
      auVar69._52_4_ = -88.37626;
      auVar69._56_4_ = -88.37626;
      auVar69._60_4_ = -88.37626;
      auVar69 = vmaxps_avx512f(auVar70,auVar69);
      local_1e40._0_8_ = auVar69._0_8_;
      local_1540 = local_1e40._0_8_;
      local_1e40._8_8_ = auVar69._8_8_;
      uStack_1538 = local_1e40._8_8_;
      local_1e40._16_8_ = auVar69._16_8_;
      uStack_1530 = local_1e40._16_8_;
      local_1e40._24_8_ = auVar69._24_8_;
      uStack_1528 = local_1e40._24_8_;
      local_1e40._32_8_ = auVar69._32_8_;
      uStack_1520 = local_1e40._32_8_;
      local_1e40._40_8_ = auVar69._40_8_;
      uStack_1518 = local_1e40._40_8_;
      local_1e40._48_8_ = auVar69._48_8_;
      uStack_1510 = local_1e40._48_8_;
      local_1e40._56_8_ = auVar69._56_8_;
      uStack_1508 = local_1e40._56_8_;
      local_1580[0] = 1.442695;
      local_1580[1] = 1.442695;
      afStack_1578[0] = 1.442695;
      afStack_1578[1] = 1.442695;
      afStack_1570[0] = 1.442695;
      afStack_1570[1] = 1.442695;
      afStack_1568[0] = 1.442695;
      afStack_1568[1] = 1.442695;
      afStack_1560[0] = 1.442695;
      afStack_1560[1] = 1.442695;
      afStack_1558[0] = 1.442695;
      afStack_1558[1] = 1.442695;
      afStack_1550[0] = 1.442695;
      afStack_1550[1] = 1.442695;
      afStack_1548[0] = 1.442695;
      afStack_1548[1] = 1.442695;
      local_15c0[0] = 0.5;
      local_15c0[1] = 0.5;
      afStack_15b8[0] = 0.5;
      afStack_15b8[1] = 0.5;
      afStack_15b0[0] = 0.5;
      afStack_15b0[1] = 0.5;
      afStack_15a8[0] = 0.5;
      afStack_15a8[1] = 0.5;
      afStack_15a0[0] = 0.5;
      afStack_15a0[1] = 0.5;
      afStack_1598[0] = 0.5;
      afStack_1598[1] = 0.5;
      afStack_1590[0] = 0.5;
      afStack_1590[1] = 0.5;
      afStack_1588[0] = 0.5;
      afStack_1588[1] = 0.5;
      auVar33._8_4_ = 1.442695;
      auVar33._12_4_ = 1.442695;
      auVar33._0_4_ = 1.442695;
      auVar33._4_4_ = 1.442695;
      auVar33._16_4_ = 1.442695;
      auVar33._20_4_ = 1.442695;
      auVar33._24_4_ = 1.442695;
      auVar33._28_4_ = 1.442695;
      auVar33._32_4_ = 1.442695;
      auVar33._36_4_ = 1.442695;
      auVar33._40_4_ = 1.442695;
      auVar33._44_4_ = 1.442695;
      auVar33._48_4_ = 1.442695;
      auVar33._52_4_ = 1.442695;
      auVar33._56_4_ = 1.442695;
      auVar33._60_4_ = 1.442695;
      auVar32._8_4_ = 0.5;
      auVar32._12_4_ = 0.5;
      auVar32._0_4_ = 0.5;
      auVar32._4_4_ = 0.5;
      auVar32._16_4_ = 0.5;
      auVar32._20_4_ = 0.5;
      auVar32._24_4_ = 0.5;
      auVar32._28_4_ = 0.5;
      auVar32._32_4_ = 0.5;
      auVar32._36_4_ = 0.5;
      auVar32._40_4_ = 0.5;
      auVar32._44_4_ = 0.5;
      auVar32._48_4_ = 0.5;
      auVar32._52_4_ = 0.5;
      auVar32._56_4_ = 0.5;
      auVar32._60_4_ = 0.5;
      auVar70 = vfmadd213ps_avx512f(auVar33,auVar69,auVar32);
      auVar71 = vrndscaleps_avx512f(auVar70,1);
      uVar22 = vcmpps_avx512f(auVar70,auVar71,1);
      local_1f42 = (ushort)uVar22;
      local_1e80._0_8_ = auVar71._0_8_;
      local_14c0 = local_1e80._0_8_;
      local_1e80._8_8_ = auVar71._8_8_;
      uStack_14b8 = local_1e80._8_8_;
      local_1e80._16_8_ = auVar71._16_8_;
      uStack_14b0 = local_1e80._16_8_;
      local_1e80._24_8_ = auVar71._24_8_;
      uStack_14a8 = local_1e80._24_8_;
      local_1e80._32_8_ = auVar71._32_8_;
      uStack_14a0 = local_1e80._32_8_;
      local_1e80._40_8_ = auVar71._40_8_;
      uStack_1498 = local_1e80._40_8_;
      local_1e80._48_8_ = auVar71._48_8_;
      uStack_1490 = local_1e80._48_8_;
      local_1e80._56_8_ = auVar71._56_8_;
      uStack_1488 = local_1e80._56_8_;
      local_1500[0] = 1.0;
      local_1500[1] = 1.0;
      afStack_14f8[0] = 1.0;
      afStack_14f8[1] = 1.0;
      afStack_14f0[0] = 1.0;
      afStack_14f0[1] = 1.0;
      afStack_14e8[0] = 1.0;
      afStack_14e8[1] = 1.0;
      afStack_14e0[0] = 1.0;
      afStack_14e0[1] = 1.0;
      afStack_14d8[0] = 1.0;
      afStack_14d8[1] = 1.0;
      afStack_14d0[0] = 1.0;
      afStack_14d0[1] = 1.0;
      afStack_14c8[0] = 1.0;
      afStack_14c8[1] = 1.0;
      local_13c0 = local_1e80._0_8_;
      uStack_13b8 = local_1e80._8_8_;
      uStack_13b0 = local_1e80._16_8_;
      uStack_13a8 = local_1e80._24_8_;
      uStack_13a0 = local_1e80._32_8_;
      uStack_1398 = local_1e80._40_8_;
      uStack_1390 = local_1e80._48_8_;
      uStack_1388 = local_1e80._56_8_;
      local_1400[0] = 1.0;
      local_1400[1] = 1.0;
      afStack_13f8[0] = 1.0;
      afStack_13f8[1] = 1.0;
      afStack_13f0[0] = 1.0;
      afStack_13f0[1] = 1.0;
      afStack_13e8[0] = 1.0;
      afStack_13e8[1] = 1.0;
      afStack_13e0[0] = 1.0;
      afStack_13e0[1] = 1.0;
      afStack_13d8[0] = 1.0;
      afStack_13d8[1] = 1.0;
      afStack_13d0[0] = 1.0;
      afStack_13d0[1] = 1.0;
      afStack_13c8[0] = 1.0;
      afStack_13c8[1] = 1.0;
      auVar34._8_4_ = 1.0;
      auVar34._12_4_ = 1.0;
      auVar34._0_4_ = 1.0;
      auVar34._4_4_ = 1.0;
      auVar34._16_4_ = 1.0;
      auVar34._20_4_ = 1.0;
      auVar34._24_4_ = 1.0;
      auVar34._28_4_ = 1.0;
      auVar34._32_4_ = 1.0;
      auVar34._36_4_ = 1.0;
      auVar34._40_4_ = 1.0;
      auVar34._44_4_ = 1.0;
      auVar34._48_4_ = 1.0;
      auVar34._52_4_ = 1.0;
      auVar34._56_4_ = 1.0;
      auVar34._60_4_ = 1.0;
      local_1440._0_4_ = auVar71._0_4_;
      local_1440._4_4_ = auVar71._4_4_;
      uStack_1438._0_4_ = auVar71._8_4_;
      uStack_1438._4_4_ = auVar71._12_4_;
      uStack_1430._0_4_ = auVar71._16_4_;
      uStack_1430._4_4_ = auVar71._20_4_;
      uStack_1428._0_4_ = auVar71._24_4_;
      uStack_1428._4_4_ = auVar71._28_4_;
      uStack_1420._0_4_ = auVar71._32_4_;
      uStack_1420._4_4_ = auVar71._36_4_;
      uStack_1418._0_4_ = auVar71._40_4_;
      uStack_1418._4_4_ = auVar71._44_4_;
      uStack_1410._0_4_ = auVar71._48_4_;
      uStack_1410._4_4_ = auVar71._52_4_;
      uStack_1408._0_4_ = auVar71._56_4_;
      uStack_1408._4_4_ = auVar71._60_4_;
      auVar70 = vsubps_avx512f(auVar71,auVar34);
      bVar1 = (bool)((byte)uVar22 & 1);
      bVar2 = (bool)((byte)(local_1f42 >> 1) & 1);
      bVar3 = (bool)((byte)(local_1f42 >> 2) & 1);
      bVar4 = (bool)((byte)(local_1f42 >> 3) & 1);
      bVar5 = (bool)((byte)(local_1f42 >> 4) & 1);
      bVar6 = (bool)((byte)(local_1f42 >> 5) & 1);
      bVar7 = (bool)((byte)(local_1f42 >> 6) & 1);
      bVar8 = (bool)((byte)(local_1f42 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar22 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_1ec0._4_4_ = (uint)bVar2 * auVar70._4_4_ | (uint)!bVar2 * local_1440._4_4_;
      local_1ec0._0_4_ = (uint)bVar1 * auVar70._0_4_ | (uint)!bVar1 * (int)local_1440;
      local_1ec0._8_4_ = (uint)bVar3 * auVar70._8_4_ | (uint)!bVar3 * (int)uStack_1438;
      local_1ec0._12_4_ = (uint)bVar4 * auVar70._12_4_ | (uint)!bVar4 * uStack_1438._4_4_;
      uStack_1eb0._0_4_ = (uint)bVar5 * auVar70._16_4_ | (uint)!bVar5 * (int)uStack_1430;
      uStack_1eb0._4_4_ = (uint)bVar6 * auVar70._20_4_ | (uint)!bVar6 * uStack_1430._4_4_;
      auVar64 = _local_1ec0;
      uStack_1ea8._0_4_ = (uint)bVar7 * auVar70._24_4_ | (uint)!bVar7 * (int)uStack_1428;
      uStack_1ea8._4_4_ = (uint)bVar8 * auVar70._28_4_ | (uint)!bVar8 * uStack_1428._4_4_;
      auVar73 = _local_1ec0;
      uStack_1ea0._0_4_ =
           (uint)(bVar9 & 1) * auVar70._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_1420;
      uStack_1ea0._4_4_ = (uint)bVar10 * auVar70._36_4_ | (uint)!bVar10 * uStack_1420._4_4_;
      auVar65 = _local_1ec0;
      uStack_1e98._0_4_ = (uint)bVar11 * auVar70._40_4_ | (uint)!bVar11 * (int)uStack_1418;
      uStack_1e98._4_4_ = (uint)bVar12 * auVar70._44_4_ | (uint)!bVar12 * uStack_1418._4_4_;
      auVar66 = _local_1ec0;
      uStack_1e90._0_4_ = (uint)bVar13 * auVar70._48_4_ | (uint)!bVar13 * (int)uStack_1410;
      uStack_1e90._4_4_ = (uint)bVar14 * auVar70._52_4_ | (uint)!bVar14 * uStack_1410._4_4_;
      auVar67 = _local_1ec0;
      uStack_1e88._0_4_ = (uint)bVar15 * auVar70._56_4_ | (uint)!bVar15 * (int)uStack_1408;
      uStack_1e88._4_4_ =
           (uint)(bVar9 >> 7) * auVar70._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_1408._4_4_;
      auVar70 = _local_1ec0;
      local_1240 = local_1ec0._0_8_;
      uStack_1238 = local_1ec0._8_8_;
      uStack_1eb0 = auVar64._16_8_;
      uStack_1230 = uStack_1eb0;
      uStack_1ea8 = auVar73._24_8_;
      uStack_1228 = uStack_1ea8;
      uStack_1ea0 = auVar65._32_8_;
      uStack_1220 = uStack_1ea0;
      uStack_1e98 = auVar66._40_8_;
      uStack_1218 = uStack_1e98;
      uStack_1e90 = auVar67._48_8_;
      uStack_1210 = uStack_1e90;
      uStack_1e88 = auVar70._56_8_;
      uStack_1208 = uStack_1e88;
      local_1280[0] = 0.6933594;
      local_1280[1] = 0.6933594;
      afStack_1278[0] = 0.6933594;
      afStack_1278[1] = 0.6933594;
      afStack_1270[0] = 0.6933594;
      afStack_1270[1] = 0.6933594;
      afStack_1268[0] = 0.6933594;
      afStack_1268[1] = 0.6933594;
      afStack_1260[0] = 0.6933594;
      afStack_1260[1] = 0.6933594;
      afStack_1258[0] = 0.6933594;
      afStack_1258[1] = 0.6933594;
      afStack_1250[0] = 0.6933594;
      afStack_1250[1] = 0.6933594;
      afStack_1248[0] = 0.6933594;
      afStack_1248[1] = 0.6933594;
      local_12c0 = local_1e40._0_8_;
      uStack_12b8 = local_1e40._8_8_;
      uStack_12b0 = local_1e40._16_8_;
      uStack_12a8 = local_1e40._24_8_;
      uStack_12a0 = local_1e40._32_8_;
      uStack_1298 = local_1e40._40_8_;
      uStack_1290 = local_1e40._48_8_;
      uStack_1288 = local_1e40._56_8_;
      auVar38._16_8_ = uStack_1eb0;
      auVar38._0_16_ = local_1ec0;
      auVar38._24_8_ = uStack_1ea8;
      auVar38._32_8_ = uStack_1ea0;
      auVar38._40_8_ = uStack_1e98;
      auVar38._48_8_ = uStack_1e90;
      auVar38._56_8_ = uStack_1e88;
      auVar37._8_4_ = 0.6933594;
      auVar37._12_4_ = 0.6933594;
      auVar37._0_4_ = 0.6933594;
      auVar37._4_4_ = 0.6933594;
      auVar37._16_4_ = 0.6933594;
      auVar37._20_4_ = 0.6933594;
      auVar37._24_4_ = 0.6933594;
      auVar37._28_4_ = 0.6933594;
      auVar37._32_4_ = 0.6933594;
      auVar37._36_4_ = 0.6933594;
      auVar37._40_4_ = 0.6933594;
      auVar37._44_4_ = 0.6933594;
      auVar37._48_4_ = 0.6933594;
      auVar37._52_4_ = 0.6933594;
      auVar37._56_4_ = 0.6933594;
      auVar37._60_4_ = 0.6933594;
      auVar69 = vfnmadd213ps_avx512f(auVar37,auVar38,auVar69);
      local_1300 = local_1ec0._0_8_;
      uStack_12f8 = local_1ec0._8_8_;
      uStack_12f0 = uStack_1eb0;
      uStack_12e8 = uStack_1ea8;
      uStack_12e0 = uStack_1ea0;
      uStack_12d8 = uStack_1e98;
      uStack_12d0 = uStack_1e90;
      uStack_12c8 = uStack_1e88;
      local_1340[0] = -0.00021219444;
      local_1340[1] = -0.00021219444;
      afStack_1338[0] = -0.00021219444;
      afStack_1338[1] = -0.00021219444;
      afStack_1330[0] = -0.00021219444;
      afStack_1330[1] = -0.00021219444;
      afStack_1328[0] = -0.00021219444;
      afStack_1328[1] = -0.00021219444;
      afStack_1320[0] = -0.00021219444;
      afStack_1320[1] = -0.00021219444;
      afStack_1318[0] = -0.00021219444;
      afStack_1318[1] = -0.00021219444;
      afStack_1310[0] = -0.00021219444;
      afStack_1310[1] = -0.00021219444;
      afStack_1308[0] = -0.00021219444;
      afStack_1308[1] = -0.00021219444;
      local_1e40._0_8_ = auVar69._0_8_;
      local_1380 = local_1e40._0_8_;
      local_1e40._8_8_ = auVar69._8_8_;
      uStack_1378 = local_1e40._8_8_;
      local_1e40._16_8_ = auVar69._16_8_;
      uStack_1370 = local_1e40._16_8_;
      local_1e40._24_8_ = auVar69._24_8_;
      uStack_1368 = local_1e40._24_8_;
      local_1e40._32_8_ = auVar69._32_8_;
      uStack_1360 = local_1e40._32_8_;
      local_1e40._40_8_ = auVar69._40_8_;
      uStack_1358 = local_1e40._40_8_;
      local_1e40._48_8_ = auVar69._48_8_;
      uStack_1350 = local_1e40._48_8_;
      local_1e40._56_8_ = auVar69._56_8_;
      uStack_1348 = local_1e40._56_8_;
      auVar36._16_8_ = uStack_1eb0;
      auVar36._0_16_ = local_1ec0;
      auVar36._24_8_ = uStack_1ea8;
      auVar36._32_8_ = uStack_1ea0;
      auVar36._40_8_ = uStack_1e98;
      auVar36._48_8_ = uStack_1e90;
      auVar36._56_8_ = uStack_1e88;
      auVar35._8_4_ = -0.00021219444;
      auVar35._12_4_ = -0.00021219444;
      auVar35._0_4_ = -0.00021219444;
      auVar35._4_4_ = -0.00021219444;
      auVar35._16_4_ = -0.00021219444;
      auVar35._20_4_ = -0.00021219444;
      auVar35._24_4_ = -0.00021219444;
      auVar35._28_4_ = -0.00021219444;
      auVar35._32_4_ = -0.00021219444;
      auVar35._36_4_ = -0.00021219444;
      auVar35._40_4_ = -0.00021219444;
      auVar35._44_4_ = -0.00021219444;
      auVar35._48_4_ = -0.00021219444;
      auVar35._52_4_ = -0.00021219444;
      auVar35._56_4_ = -0.00021219444;
      auVar35._60_4_ = -0.00021219444;
      local_1e40 = vfnmadd213ps_avx512f(auVar35,auVar36,auVar69);
      local_1b40 = local_1e40._0_8_;
      uStack_1b38 = local_1e40._8_8_;
      uStack_1b30 = local_1e40._16_8_;
      uStack_1b28 = local_1e40._24_8_;
      uStack_1b20 = local_1e40._32_8_;
      uStack_1b18 = local_1e40._40_8_;
      uStack_1b10 = local_1e40._48_8_;
      uStack_1b08 = local_1e40._56_8_;
      local_1e80 = vmulps_avx512f(local_1e40,local_1e40);
      uStack_1fb8._0_4_ = 0.00019875691;
      uStack_1fb8._4_4_ = 0.00019875691;
      local_1fc0._0_4_ = 0.00019875691;
      local_1fc0._4_4_ = 0.00019875691;
      local_1600[0] = 0.00019875691;
      local_1600[1] = 0.00019875691;
      afStack_15f8[0] = 0.00019875691;
      afStack_15f8[1] = 0.00019875691;
      afStack_15f0[0] = 0.00019875691;
      afStack_15f0[1] = 0.00019875691;
      afStack_15e8[0] = 0.00019875691;
      afStack_15e8[1] = 0.00019875691;
      afStack_15e0[0] = 0.00019875691;
      afStack_15e0[1] = 0.00019875691;
      afStack_15d8[0] = 0.00019875691;
      afStack_15d8[1] = 0.00019875691;
      afStack_15d0[0] = 0.00019875691;
      afStack_15d0[1] = 0.00019875691;
      afStack_15c8[0] = 0.00019875691;
      afStack_15c8[1] = 0.00019875691;
      local_1640 = local_1e40._0_8_;
      uStack_1638 = local_1e40._8_8_;
      uStack_1630 = local_1e40._16_8_;
      uStack_1628 = local_1e40._24_8_;
      uStack_1620 = local_1e40._32_8_;
      uStack_1618 = local_1e40._40_8_;
      uStack_1610 = local_1e40._48_8_;
      uStack_1608 = local_1e40._56_8_;
      local_1680[0] = 0.0013981999;
      local_1680[1] = 0.0013981999;
      afStack_1678[0] = 0.0013981999;
      afStack_1678[1] = 0.0013981999;
      afStack_1670[0] = 0.0013981999;
      afStack_1670[1] = 0.0013981999;
      afStack_1668[0] = 0.0013981999;
      afStack_1668[1] = 0.0013981999;
      afStack_1660[0] = 0.0013981999;
      afStack_1660[1] = 0.0013981999;
      afStack_1658[0] = 0.0013981999;
      afStack_1658[1] = 0.0013981999;
      afStack_1650[0] = 0.0013981999;
      afStack_1650[1] = 0.0013981999;
      afStack_1648[0] = 0.0013981999;
      afStack_1648[1] = 0.0013981999;
      auVar31._16_4_ = 0.00019875691;
      auVar31._20_4_ = 0.00019875691;
      auVar31._0_16_ = _local_1fc0;
      auVar31._24_4_ = 0.00019875691;
      auVar31._28_4_ = 0.00019875691;
      auVar31._32_4_ = 0.00019875691;
      auVar31._36_4_ = 0.00019875691;
      auVar31._40_4_ = 0.00019875691;
      auVar31._44_4_ = 0.00019875691;
      auVar31._48_4_ = 0.00019875691;
      auVar31._52_4_ = 0.00019875691;
      auVar31._56_4_ = 0.00019875691;
      auVar31._60_4_ = 0.00019875691;
      auVar30._8_4_ = 0.0013981999;
      auVar30._12_4_ = 0.0013981999;
      auVar30._0_4_ = 0.0013981999;
      auVar30._4_4_ = 0.0013981999;
      auVar30._16_4_ = 0.0013981999;
      auVar30._20_4_ = 0.0013981999;
      auVar30._24_4_ = 0.0013981999;
      auVar30._28_4_ = 0.0013981999;
      auVar30._32_4_ = 0.0013981999;
      auVar30._36_4_ = 0.0013981999;
      auVar30._40_4_ = 0.0013981999;
      auVar30._44_4_ = 0.0013981999;
      auVar30._48_4_ = 0.0013981999;
      auVar30._52_4_ = 0.0013981999;
      auVar30._56_4_ = 0.0013981999;
      auVar30._60_4_ = 0.0013981999;
      auVar69 = vfmadd213ps_avx512f(local_1e40,auVar31,auVar30);
      local_1fc0 = auVar69._0_8_;
      local_16c0 = local_1fc0;
      uStack_1fb8 = auVar69._8_8_;
      uStack_16b8 = uStack_1fb8;
      uStack_1fb0 = auVar69._16_8_;
      uStack_16b0 = uStack_1fb0;
      uStack_1fa8 = auVar69._24_8_;
      uStack_16a8 = uStack_1fa8;
      uStack_1fa0 = auVar69._32_8_;
      uStack_16a0 = uStack_1fa0;
      uStack_1f98 = auVar69._40_8_;
      uStack_1698 = uStack_1f98;
      uStack_1f90 = auVar69._48_8_;
      uStack_1690 = uStack_1f90;
      uStack_1f88 = auVar69._56_8_;
      uStack_1688 = uStack_1f88;
      local_1700 = local_1e40._0_8_;
      uStack_16f8 = local_1e40._8_8_;
      uStack_16f0 = local_1e40._16_8_;
      uStack_16e8 = local_1e40._24_8_;
      uStack_16e0 = local_1e40._32_8_;
      uStack_16d8 = local_1e40._40_8_;
      uStack_16d0 = local_1e40._48_8_;
      uStack_16c8 = local_1e40._56_8_;
      local_1740[0] = 0.008333452;
      local_1740[1] = 0.008333452;
      afStack_1738[0] = 0.008333452;
      afStack_1738[1] = 0.008333452;
      afStack_1730[0] = 0.008333452;
      afStack_1730[1] = 0.008333452;
      afStack_1728[0] = 0.008333452;
      afStack_1728[1] = 0.008333452;
      afStack_1720[0] = 0.008333452;
      afStack_1720[1] = 0.008333452;
      afStack_1718[0] = 0.008333452;
      afStack_1718[1] = 0.008333452;
      afStack_1710[0] = 0.008333452;
      afStack_1710[1] = 0.008333452;
      afStack_1708[0] = 0.008333452;
      afStack_1708[1] = 0.008333452;
      auVar29._8_4_ = 0.008333452;
      auVar29._12_4_ = 0.008333452;
      auVar29._0_4_ = 0.008333452;
      auVar29._4_4_ = 0.008333452;
      auVar29._16_4_ = 0.008333452;
      auVar29._20_4_ = 0.008333452;
      auVar29._24_4_ = 0.008333452;
      auVar29._28_4_ = 0.008333452;
      auVar29._32_4_ = 0.008333452;
      auVar29._36_4_ = 0.008333452;
      auVar29._40_4_ = 0.008333452;
      auVar29._44_4_ = 0.008333452;
      auVar29._48_4_ = 0.008333452;
      auVar29._52_4_ = 0.008333452;
      auVar29._56_4_ = 0.008333452;
      auVar29._60_4_ = 0.008333452;
      auVar69 = vfmadd213ps_avx512f(local_1e40,auVar69,auVar29);
      local_1fc0 = auVar69._0_8_;
      local_1780 = local_1fc0;
      uStack_1fb8 = auVar69._8_8_;
      uStack_1778 = uStack_1fb8;
      uStack_1fb0 = auVar69._16_8_;
      uStack_1770 = uStack_1fb0;
      uStack_1fa8 = auVar69._24_8_;
      uStack_1768 = uStack_1fa8;
      uStack_1fa0 = auVar69._32_8_;
      uStack_1760 = uStack_1fa0;
      uStack_1f98 = auVar69._40_8_;
      uStack_1758 = uStack_1f98;
      uStack_1f90 = auVar69._48_8_;
      uStack_1750 = uStack_1f90;
      uStack_1f88 = auVar69._56_8_;
      uStack_1748 = uStack_1f88;
      local_17c0 = local_1e40._0_8_;
      uStack_17b8 = local_1e40._8_8_;
      uStack_17b0 = local_1e40._16_8_;
      uStack_17a8 = local_1e40._24_8_;
      uStack_17a0 = local_1e40._32_8_;
      uStack_1798 = local_1e40._40_8_;
      uStack_1790 = local_1e40._48_8_;
      uStack_1788 = local_1e40._56_8_;
      local_1800[0] = 0.041665796;
      local_1800[1] = 0.041665796;
      afStack_17f8[0] = 0.041665796;
      afStack_17f8[1] = 0.041665796;
      afStack_17f0[0] = 0.041665796;
      afStack_17f0[1] = 0.041665796;
      afStack_17e8[0] = 0.041665796;
      afStack_17e8[1] = 0.041665796;
      afStack_17e0[0] = 0.041665796;
      afStack_17e0[1] = 0.041665796;
      afStack_17d8[0] = 0.041665796;
      afStack_17d8[1] = 0.041665796;
      afStack_17d0[0] = 0.041665796;
      afStack_17d0[1] = 0.041665796;
      afStack_17c8[0] = 0.041665796;
      afStack_17c8[1] = 0.041665796;
      auVar28._8_4_ = 0.041665796;
      auVar28._12_4_ = 0.041665796;
      auVar28._0_4_ = 0.041665796;
      auVar28._4_4_ = 0.041665796;
      auVar28._16_4_ = 0.041665796;
      auVar28._20_4_ = 0.041665796;
      auVar28._24_4_ = 0.041665796;
      auVar28._28_4_ = 0.041665796;
      auVar28._32_4_ = 0.041665796;
      auVar28._36_4_ = 0.041665796;
      auVar28._40_4_ = 0.041665796;
      auVar28._44_4_ = 0.041665796;
      auVar28._48_4_ = 0.041665796;
      auVar28._52_4_ = 0.041665796;
      auVar28._56_4_ = 0.041665796;
      auVar28._60_4_ = 0.041665796;
      auVar69 = vfmadd213ps_avx512f(local_1e40,auVar69,auVar28);
      local_1fc0 = auVar69._0_8_;
      local_1840 = local_1fc0;
      uStack_1fb8 = auVar69._8_8_;
      uStack_1838 = uStack_1fb8;
      uStack_1fb0 = auVar69._16_8_;
      uStack_1830 = uStack_1fb0;
      uStack_1fa8 = auVar69._24_8_;
      uStack_1828 = uStack_1fa8;
      uStack_1fa0 = auVar69._32_8_;
      uStack_1820 = uStack_1fa0;
      uStack_1f98 = auVar69._40_8_;
      uStack_1818 = uStack_1f98;
      uStack_1f90 = auVar69._48_8_;
      uStack_1810 = uStack_1f90;
      uStack_1f88 = auVar69._56_8_;
      uStack_1808 = uStack_1f88;
      local_1880 = local_1e40._0_8_;
      uStack_1878 = local_1e40._8_8_;
      uStack_1870 = local_1e40._16_8_;
      uStack_1868 = local_1e40._24_8_;
      uStack_1860 = local_1e40._32_8_;
      uStack_1858 = local_1e40._40_8_;
      uStack_1850 = local_1e40._48_8_;
      uStack_1848 = local_1e40._56_8_;
      local_18c0[0] = 0.16666666;
      local_18c0[1] = 0.16666666;
      afStack_18b8[0] = 0.16666666;
      afStack_18b8[1] = 0.16666666;
      afStack_18b0[0] = 0.16666666;
      afStack_18b0[1] = 0.16666666;
      afStack_18a8[0] = 0.16666666;
      afStack_18a8[1] = 0.16666666;
      afStack_18a0[0] = 0.16666666;
      afStack_18a0[1] = 0.16666666;
      afStack_1898[0] = 0.16666666;
      afStack_1898[1] = 0.16666666;
      afStack_1890[0] = 0.16666666;
      afStack_1890[1] = 0.16666666;
      afStack_1888[0] = 0.16666666;
      afStack_1888[1] = 0.16666666;
      auVar27._8_4_ = 0.16666666;
      auVar27._12_4_ = 0.16666666;
      auVar27._0_4_ = 0.16666666;
      auVar27._4_4_ = 0.16666666;
      auVar27._16_4_ = 0.16666666;
      auVar27._20_4_ = 0.16666666;
      auVar27._24_4_ = 0.16666666;
      auVar27._28_4_ = 0.16666666;
      auVar27._32_4_ = 0.16666666;
      auVar27._36_4_ = 0.16666666;
      auVar27._40_4_ = 0.16666666;
      auVar27._44_4_ = 0.16666666;
      auVar27._48_4_ = 0.16666666;
      auVar27._52_4_ = 0.16666666;
      auVar27._56_4_ = 0.16666666;
      auVar27._60_4_ = 0.16666666;
      auVar69 = vfmadd213ps_avx512f(local_1e40,auVar69,auVar27);
      local_1fc0 = auVar69._0_8_;
      local_1900 = local_1fc0;
      uStack_1fb8 = auVar69._8_8_;
      uStack_18f8 = uStack_1fb8;
      uStack_1fb0 = auVar69._16_8_;
      uStack_18f0 = uStack_1fb0;
      uStack_1fa8 = auVar69._24_8_;
      uStack_18e8 = uStack_1fa8;
      uStack_1fa0 = auVar69._32_8_;
      uStack_18e0 = uStack_1fa0;
      uStack_1f98 = auVar69._40_8_;
      uStack_18d8 = uStack_1f98;
      uStack_1f90 = auVar69._48_8_;
      uStack_18d0 = uStack_1f90;
      uStack_1f88 = auVar69._56_8_;
      uStack_18c8 = uStack_1f88;
      local_1940 = local_1e40._0_8_;
      uStack_1938 = local_1e40._8_8_;
      uStack_1930 = local_1e40._16_8_;
      uStack_1928 = local_1e40._24_8_;
      uStack_1920 = local_1e40._32_8_;
      uStack_1918 = local_1e40._40_8_;
      uStack_1910 = local_1e40._48_8_;
      uStack_1908 = local_1e40._56_8_;
      local_1980[0] = 0.5;
      local_1980[1] = 0.5;
      afStack_1978[0] = 0.5;
      afStack_1978[1] = 0.5;
      afStack_1970[0] = 0.5;
      afStack_1970[1] = 0.5;
      afStack_1968[0] = 0.5;
      afStack_1968[1] = 0.5;
      afStack_1960[0] = 0.5;
      afStack_1960[1] = 0.5;
      afStack_1958[0] = 0.5;
      afStack_1958[1] = 0.5;
      afStack_1950[0] = 0.5;
      afStack_1950[1] = 0.5;
      afStack_1948[0] = 0.5;
      afStack_1948[1] = 0.5;
      auVar72._8_4_ = 0.5;
      auVar72._12_4_ = 0.5;
      auVar72._0_4_ = 0.5;
      auVar72._4_4_ = 0.5;
      auVar72._16_4_ = 0.5;
      auVar72._20_4_ = 0.5;
      auVar72._24_4_ = 0.5;
      auVar72._28_4_ = 0.5;
      auVar72._32_4_ = 0.5;
      auVar72._36_4_ = 0.5;
      auVar72._40_4_ = 0.5;
      auVar72._44_4_ = 0.5;
      auVar72._48_4_ = 0.5;
      auVar72._52_4_ = 0.5;
      auVar72._56_4_ = 0.5;
      auVar72._60_4_ = 0.5;
      auVar69 = vfmadd213ps_avx512f(local_1e40,auVar69,auVar72);
      local_1fc0 = auVar69._0_8_;
      local_19c0 = local_1fc0;
      uStack_1fb8 = auVar69._8_8_;
      uStack_19b8 = uStack_1fb8;
      uStack_1fb0 = auVar69._16_8_;
      uStack_19b0 = uStack_1fb0;
      uStack_1fa8 = auVar69._24_8_;
      uStack_19a8 = uStack_1fa8;
      uStack_1fa0 = auVar69._32_8_;
      uStack_19a0 = uStack_1fa0;
      uStack_1f98 = auVar69._40_8_;
      uStack_1998 = uStack_1f98;
      uStack_1f90 = auVar69._48_8_;
      uStack_1990 = uStack_1f90;
      uStack_1f88 = auVar69._56_8_;
      uStack_1988 = uStack_1f88;
      local_1a00 = local_1e80._0_8_;
      uStack_19f8 = local_1e80._8_8_;
      uStack_19f0 = local_1e80._16_8_;
      uStack_19e8 = local_1e80._24_8_;
      uStack_19e0 = local_1e80._32_8_;
      uStack_19d8 = local_1e80._40_8_;
      uStack_19d0 = local_1e80._48_8_;
      uStack_19c8 = local_1e80._56_8_;
      local_1a40 = local_1e40._0_8_;
      uStack_1a38 = local_1e40._8_8_;
      uStack_1a30 = local_1e40._16_8_;
      uStack_1a28 = local_1e40._24_8_;
      uStack_1a20 = local_1e40._32_8_;
      uStack_1a18 = local_1e40._40_8_;
      uStack_1a10 = local_1e40._48_8_;
      uStack_1a08 = local_1e40._56_8_;
      auVar69 = vfmadd213ps_avx512f(local_1e80,auVar69,local_1e40);
      local_1fc0 = auVar69._0_8_;
      local_1c80 = local_1fc0;
      uStack_1fb8 = auVar69._8_8_;
      uStack_1c78 = uStack_1fb8;
      uStack_1fb0 = auVar69._16_8_;
      uStack_1c70 = uStack_1fb0;
      uStack_1fa8 = auVar69._24_8_;
      uStack_1c68 = uStack_1fa8;
      uStack_1fa0 = auVar69._32_8_;
      uStack_1c60 = uStack_1fa0;
      uStack_1f98 = auVar69._40_8_;
      uStack_1c58 = uStack_1f98;
      uStack_1f90 = auVar69._48_8_;
      uStack_1c50 = uStack_1f90;
      uStack_1f88 = auVar69._56_8_;
      uStack_1c48 = uStack_1f88;
      local_1cc0[0] = 1.0;
      local_1cc0[1] = 1.0;
      afStack_1cb8[0] = 1.0;
      afStack_1cb8[1] = 1.0;
      afStack_1cb0[0] = 1.0;
      afStack_1cb0[1] = 1.0;
      afStack_1ca8[0] = 1.0;
      afStack_1ca8[1] = 1.0;
      afStack_1ca0[0] = 1.0;
      afStack_1ca0[1] = 1.0;
      afStack_1c98[0] = 1.0;
      afStack_1c98[1] = 1.0;
      afStack_1c90[0] = 1.0;
      afStack_1c90[1] = 1.0;
      afStack_1c88[0] = 1.0;
      afStack_1c88[1] = 1.0;
      auVar71._8_4_ = 1.0;
      auVar71._12_4_ = 1.0;
      auVar71._0_4_ = 1.0;
      auVar71._4_4_ = 1.0;
      auVar71._16_4_ = 1.0;
      auVar71._20_4_ = 1.0;
      auVar71._24_4_ = 1.0;
      auVar71._28_4_ = 1.0;
      auVar71._32_4_ = 1.0;
      auVar71._36_4_ = 1.0;
      auVar71._40_4_ = 1.0;
      auVar71._44_4_ = 1.0;
      auVar71._48_4_ = 1.0;
      auVar71._52_4_ = 1.0;
      auVar71._56_4_ = 1.0;
      auVar71._60_4_ = 1.0;
      auVar71 = vaddps_avx512f(auVar69,auVar71);
      local_1200 = local_1ec0._0_8_;
      uStack_11f8 = local_1ec0._8_8_;
      uStack_11f0 = uStack_1eb0;
      uStack_11e8 = uStack_1ea8;
      uStack_11e0 = uStack_1ea0;
      uStack_11d8 = uStack_1e98;
      uStack_11d0 = uStack_1e90;
      uStack_11c8 = uStack_1e88;
      auVar39._16_8_ = uStack_1eb0;
      auVar39._0_16_ = local_1ec0;
      auVar39._24_8_ = uStack_1ea8;
      auVar39._32_8_ = uStack_1ea0;
      auVar39._40_8_ = uStack_1e98;
      auVar39._48_8_ = uStack_1e90;
      auVar39._56_8_ = uStack_1e88;
      auVar69 = vcvttps2dq_avx512f(auVar39);
      local_1080 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar69 = vmovdqa64_avx512f(auVar69);
      auVar69 = vmovdqa64_avx512f(auVar69);
      auVar72 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      local_1180 = vmovdqa64_avx512f(auVar69);
      local_11c0 = vmovdqa64_avx512f(auVar72);
      auVar69 = vmovdqa64_avx512f(local_1180);
      auVar72 = vmovdqa64_avx512f(local_11c0);
      auVar69 = vpaddd_avx512f(auVar69,auVar72);
      auVar69 = vmovdqa64_avx512f(auVar69);
      auVar69 = vmovdqa64_avx512f(auVar69);
      local_1100 = vmovdqa64_avx512f(auVar69);
      local_1104 = 0x17;
      auVar69 = vmovdqa64_avx512f(local_1100);
      auVar69 = vpslld_avx512f(auVar69,ZEXT416(0x17));
      local_1f00 = vmovdqa64_avx512f(auVar69);
      auVar69 = vmovdqa64_avx512f(local_1f00);
      local_10c0 = vmovdqa64_avx512f(auVar69);
      auVar69 = vmovdqa64_avx512f(local_10c0);
      local_2000 = vmovdqa64_avx512f(auVar69);
      local_1fc0 = auVar71._0_8_;
      local_1b80 = local_1fc0;
      uStack_1fb8 = auVar71._8_8_;
      uStack_1b78 = uStack_1fb8;
      uStack_1fb0 = auVar71._16_8_;
      uStack_1b70 = uStack_1fb0;
      uStack_1fa8 = auVar71._24_8_;
      uStack_1b68 = uStack_1fa8;
      uStack_1fa0 = auVar71._32_8_;
      uStack_1b60 = uStack_1fa0;
      uStack_1f98 = auVar71._40_8_;
      uStack_1b58 = uStack_1f98;
      uStack_1f90 = auVar71._48_8_;
      uStack_1b50 = uStack_1f90;
      uStack_1f88 = auVar71._56_8_;
      uStack_1b48 = uStack_1f88;
      local_1bc0 = local_2000._0_8_;
      uStack_1bb8 = local_2000._8_8_;
      uStack_1bb0 = local_2000._16_8_;
      uStack_1ba8 = local_2000._24_8_;
      uStack_1ba0 = local_2000._32_8_;
      uStack_1b98 = local_2000._40_8_;
      uStack_1b90 = local_2000._48_8_;
      uStack_1b88 = local_2000._56_8_;
      _local_1fc0 = vmulps_avx512f(auVar71,local_2000);
      local_2040 = local_1fc0;
      uStack_2038 = uStack_1fb8;
      uStack_2030 = uStack_1fb0;
      uStack_2028 = uStack_1fa8;
      uStack_2020 = uStack_1fa0;
      uStack_2018 = uStack_1f98;
      uStack_2010 = uStack_1f90;
      uStack_2008 = uStack_1f88;
      local_2410 = 0x3f800000;
      local_2480 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_2080 = local_2480._0_8_;
      uStack_2078 = local_2480._8_8_;
      uStack_2070 = local_2480._16_8_;
      uStack_2068 = local_2480._24_8_;
      uStack_2060 = local_2480._32_8_;
      uStack_2058 = local_2480._40_8_;
      uStack_2050 = local_2480._48_8_;
      uStack_2048 = local_2480._56_8_;
      local_2580 = vsubps_avx512f(_local_1fc0,local_2480);
      local_1c00 = local_2540._0_8_;
      uStack_1bf8 = local_2540._8_8_;
      uStack_1bf0 = local_2540._16_8_;
      uStack_1be8 = local_2540._24_8_;
      uStack_1be0 = local_2540._32_8_;
      uStack_1bd8 = local_2540._40_8_;
      uStack_1bd0 = local_2540._48_8_;
      uStack_1bc8 = local_2540._56_8_;
      local_1a80 = local_2680._0_8_;
      uStack_1a78 = local_2680._8_8_;
      uStack_1a70 = local_2680._16_8_;
      uStack_1a68 = local_2680._24_8_;
      uStack_1a60 = local_2680._32_8_;
      uStack_1a58 = local_2680._40_8_;
      uStack_1a50 = local_2680._48_8_;
      uStack_1a48 = local_2680._56_8_;
      local_1ac0 = local_2580._0_8_;
      uStack_1ab8 = local_2580._8_8_;
      uStack_1ab0 = local_2580._16_8_;
      uStack_1aa8 = local_2580._24_8_;
      uStack_1aa0 = local_2580._32_8_;
      uStack_1a98 = local_2580._40_8_;
      uStack_1a90 = local_2580._48_8_;
      uStack_1a88 = local_2580._56_8_;
      local_1c40 = vmulps_avx512f(local_2680,local_2580);
      local_2600 = vaddps_avx512f(local_2540,local_1c40);
      *(undefined8 *)*local_26f8 = local_2600._0_8_;
      *(undefined8 *)(*local_26f8 + 8) = local_2600._8_8_;
      *(undefined8 *)(*local_26f8 + 0x10) = local_2600._16_8_;
      *(undefined8 *)(*local_26f8 + 0x18) = local_2600._24_8_;
      *(undefined8 *)(*local_26f8 + 0x20) = local_2600._32_8_;
      *(undefined8 *)(*local_26f8 + 0x28) = local_2600._40_8_;
      *(undefined8 *)(*local_26f8 + 0x30) = local_2600._48_8_;
      *(undefined8 *)(*local_26f8 + 0x38) = local_2600._56_8_;
      local_26f8 = local_26f8 + 1;
      local_2200 = local_24c0;
      uStack_21f8 = uStack_24b8;
      uStack_21f0 = uStack_24b0;
      uStack_21e8 = uStack_24a8;
      uStack_21e0 = uStack_24a0;
      uStack_21d8 = uStack_2498;
      uStack_21d0 = uStack_2490;
      uStack_21c8 = uStack_2488;
      local_2100 = local_24c0;
      uStack_20f8 = uStack_24b8;
      uStack_20f0 = uStack_24b0;
      uStack_20e8 = uStack_24a8;
      uStack_20e0 = uStack_24a0;
      uStack_20d8 = uStack_2498;
      uStack_20d0 = uStack_2490;
      uStack_20c8 = uStack_2488;
      _local_1ec0 = auVar70;
      local_1b00 = local_1b40;
      uStack_1af8 = uStack_1b38;
      uStack_1af0 = uStack_1b30;
      uStack_1ae8 = uStack_1b28;
      uStack_1ae0 = uStack_1b20;
      uStack_1ad8 = uStack_1b18;
      uStack_1ad0 = uStack_1b10;
      uStack_1ac8 = uStack_1b08;
      local_1442 = local_1f42;
      local_1440 = local_14c0;
      uStack_1438 = uStack_14b8;
      uStack_1430 = uStack_14b0;
      uStack_1428 = uStack_14a8;
      uStack_1420 = uStack_14a0;
      uStack_1418 = uStack_1498;
      uStack_1410 = uStack_1490;
      uStack_1408 = uStack_1488;
    }
    local_240c = *(uint *)(in_RDI + 0xd0);
    auVar16 = vinsertps_avx(ZEXT416(local_240c),ZEXT416(local_240c),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(local_240c),0x20);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(local_240c),0x30);
    auVar17 = vinsertps_avx(ZEXT416(local_240c),ZEXT416(local_240c),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(local_240c),0x20);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(local_240c),0x30);
    auVar73._16_16_ = auVar16;
    auVar73._0_16_ = auVar17;
    local_fe0._0_8_ = auVar17._0_8_;
    local_fe0._8_8_ = auVar17._8_8_;
    local_fe0._16_8_ = auVar16._0_8_;
    local_fe0._24_8_ = auVar16._8_8_;
    for (; local_2750 + 7 < local_26e8; local_2750 = local_2750 + 8) {
      local_2408 = local_26f8;
      local_2360 = *(undefined8 *)*local_26f8;
      uStack_2358 = *(undefined8 *)(*local_26f8 + 8);
      uStack_2350 = *(undefined8 *)(*local_26f8 + 0x10);
      uStack_2348 = *(undefined8 *)(*local_26f8 + 0x18);
      local_23c8 = local_26f8;
      local_2380 = local_fe0._0_8_;
      uStack_2378 = local_fe0._8_8_;
      uStack_2370 = local_fe0._16_8_;
      uStack_2368 = local_fe0._24_8_;
      local_f40 = 0;
      uStack_f38 = 0;
      uStack_f30 = 0;
      uStack_f28 = 0;
      local_f80 = 0;
      uStack_f78 = 0;
      uStack_f70 = 0;
      uStack_f68 = 0;
      local_23a0 = vmaxps_avx(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])*local_26f8);
      local_f60 = 0;
      uStack_f58 = 0;
      uStack_f50 = 0;
      uStack_f48 = 0;
      local_f00 = 0;
      uStack_ef8 = 0;
      uStack_ef0 = 0;
      uStack_ee8 = 0;
      auVar20 = vminps_avx(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])*local_26f8);
      local_23c0._0_8_ = auVar20._0_8_;
      local_23c0._8_8_ = auVar20._8_8_;
      local_23c0._16_8_ = auVar20._16_8_;
      local_23c0._24_8_ = auVar20._24_8_;
      local_d60 = 0;
      uStack_d58 = 0;
      uStack_d50 = 0;
      uStack_d48 = 0;
      local_e40 = 0x3f800000;
      uStack_e3c = 0x3f800000;
      uStack_e38 = 0x3f800000;
      uStack_e34 = 0x3f800000;
      uStack_e30 = 0x3f800000;
      uStack_e2c = 0x3f800000;
      uStack_e28 = 0x3f800000;
      uStack_e24 = 0x3f800000;
      local_d20 = local_23c0._0_8_;
      uStack_d18 = local_23c0._8_8_;
      uStack_d10 = local_23c0._16_8_;
      uStack_d08 = local_23c0._24_8_;
      local_d40 = 0x42b0c0a5;
      uStack_d3c = 0x42b0c0a5;
      uStack_d38 = 0x42b0c0a5;
      uStack_d34 = 0x42b0c0a5;
      uStack_d30 = 0x42b0c0a5;
      uStack_d2c = 0x42b0c0a5;
      uStack_d28 = 0x42b0c0a5;
      uStack_d24 = 0x42b0c0a5;
      auVar40._8_4_ = 0x42b0c0a5;
      auVar40._0_8_ = 0x42b0c0a542b0c0a5;
      auVar40._12_4_ = 0x42b0c0a5;
      auVar40._16_4_ = 0x42b0c0a5;
      auVar40._20_4_ = 0x42b0c0a5;
      auVar40._24_4_ = 0x42b0c0a5;
      auVar40._28_4_ = 0x42b0c0a5;
      auVar20 = vminps_avx(auVar20,auVar40);
      local_dc0._0_8_ = auVar20._0_8_;
      local_d80 = local_dc0._0_8_;
      local_dc0._8_8_ = auVar20._8_8_;
      uStack_d78 = local_dc0._8_8_;
      local_dc0._16_8_ = auVar20._16_8_;
      uStack_d70 = local_dc0._16_8_;
      local_dc0._24_8_ = auVar20._24_8_;
      uStack_d68 = local_dc0._24_8_;
      local_da0 = 0xc2b0c0a5;
      uStack_d9c = 0xc2b0c0a5;
      uStack_d98 = 0xc2b0c0a5;
      uStack_d94 = 0xc2b0c0a5;
      uStack_d90 = 0xc2b0c0a5;
      uStack_d8c = 0xc2b0c0a5;
      uStack_d88 = 0xc2b0c0a5;
      uStack_d84 = 0xc2b0c0a5;
      auVar21._8_4_ = 0xc2b0c0a5;
      auVar21._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar21._12_4_ = 0xc2b0c0a5;
      auVar21._16_4_ = 0xc2b0c0a5;
      auVar21._20_4_ = 0xc2b0c0a5;
      auVar21._24_4_ = 0xc2b0c0a5;
      auVar21._28_4_ = 0xc2b0c0a5;
      auVar19 = vmaxps_avx(auVar20,auVar21);
      local_b68 = local_dc0;
      local_ad0 = ::_ps256_cephes_LOG2EF;
      local_ad8 = ::_ps256_0p5;
      local_dc0._0_8_ = auVar19._0_8_;
      local_940 = local_dc0._0_8_;
      local_dc0._8_8_ = auVar19._8_8_;
      uStack_938 = local_dc0._8_8_;
      local_dc0._16_8_ = auVar19._16_8_;
      uStack_930 = local_dc0._16_8_;
      local_dc0._24_8_ = auVar19._24_8_;
      uStack_928 = local_dc0._24_8_;
      local_960[0] = 1.442695;
      local_960[1] = 1.442695;
      afStack_958[0] = 1.442695;
      afStack_958[1] = 1.442695;
      afStack_950[0] = 1.442695;
      afStack_950[1] = 1.442695;
      afStack_948[0] = 1.442695;
      afStack_948[1] = 1.442695;
      local_980[0] = 0.5;
      local_980[1] = 0.5;
      afStack_978[0] = 0.5;
      afStack_978[1] = 0.5;
      afStack_970[0] = 0.5;
      afStack_970[1] = 0.5;
      afStack_968[0] = 0.5;
      afStack_968[1] = 0.5;
      auVar42._8_4_ = 1.442695;
      auVar42._12_4_ = 1.442695;
      auVar42._0_4_ = 1.442695;
      auVar42._4_4_ = 1.442695;
      auVar42._16_4_ = 1.442695;
      auVar42._20_4_ = 1.442695;
      auVar42._24_4_ = 1.442695;
      auVar42._28_4_ = 1.442695;
      auVar41._8_4_ = 0.5;
      auVar41._12_4_ = 0.5;
      auVar41._0_4_ = 0.5;
      auVar41._4_4_ = 0.5;
      auVar41._16_4_ = 0.5;
      auVar41._20_4_ = 0.5;
      auVar41._24_4_ = 0.5;
      auVar41._28_4_ = 0.5;
      auVar23 = vfmadd213ps_fma(auVar42,auVar19,auVar41);
      auVar21 = vroundps_avx(ZEXT1632(auVar23),1);
      auVar20 = vcmpps_avx(ZEXT1632(auVar23),auVar21,1);
      local_e60._0_8_ = auVar20._0_8_;
      local_aa0 = local_e60._0_8_;
      local_e60._8_8_ = auVar20._8_8_;
      uStack_a98 = local_e60._8_8_;
      local_e60._16_8_ = auVar20._16_8_;
      uStack_a90 = local_e60._16_8_;
      local_e60._24_8_ = auVar20._24_8_;
      uStack_a88 = local_e60._24_8_;
      local_ac0 = 0x3f8000003f800000;
      uStack_ab8 = 0x3f8000003f800000;
      uStack_ab0 = 0x3f8000003f800000;
      uStack_aa8 = 0x3f8000003f800000;
      auVar74._8_8_ = 0x3f8000003f800000;
      auVar74._0_8_ = 0x3f8000003f800000;
      auVar74._16_8_ = 0x3f8000003f800000;
      auVar74._24_8_ = 0x3f8000003f800000;
      local_e60 = vpand_avx2(auVar20,auVar74);
      local_de0 = auVar21._0_8_;
      local_ce0 = local_de0;
      uStack_dd8 = auVar21._8_8_;
      uStack_cd8 = uStack_dd8;
      uStack_dd0 = auVar21._16_8_;
      uStack_cd0 = uStack_dd0;
      uStack_dc8 = auVar21._24_8_;
      uStack_cc8 = uStack_dc8;
      local_d00 = local_e60._0_8_;
      uStack_cf8 = local_e60._8_8_;
      uStack_cf0 = local_e60._16_8_;
      uStack_ce8 = local_e60._24_8_;
      local_e00 = vsubps_avx(auVar21,local_e60);
      local_a60 = local_e00;
      local_a50 = ::_ps256_cephes_exp_C1;
      local_6a0 = local_e00._0_8_;
      uStack_698 = local_e00._8_8_;
      uStack_690 = local_e00._16_8_;
      uStack_688 = local_e00._24_8_;
      local_6c0[0] = 0.6933594;
      local_6c0[1] = 0.6933594;
      afStack_6b8[0] = 0.6933594;
      afStack_6b8[1] = 0.6933594;
      afStack_6b0[0] = 0.6933594;
      afStack_6b0[1] = 0.6933594;
      afStack_6a8[0] = 0.6933594;
      afStack_6a8[1] = 0.6933594;
      local_6e0 = local_dc0._0_8_;
      uStack_6d8 = local_dc0._8_8_;
      uStack_6d0 = local_dc0._16_8_;
      uStack_6c8 = local_dc0._24_8_;
      auVar48._8_4_ = 0.6933594;
      auVar48._12_4_ = 0.6933594;
      auVar48._0_4_ = 0.6933594;
      auVar48._4_4_ = 0.6933594;
      auVar48._16_4_ = 0.6933594;
      auVar48._20_4_ = 0.6933594;
      auVar48._24_4_ = 0.6933594;
      auVar48._28_4_ = 0.6933594;
      auVar23 = vfnmadd213ps_fma(auVar48,local_e00,auVar19);
      local_a68 = ::_ps256_cephes_exp_C2;
      local_640 = local_e00._0_8_;
      uStack_638 = local_e00._8_8_;
      uStack_630 = local_e00._16_8_;
      uStack_628 = local_e00._24_8_;
      local_660[0] = -0.00021219444;
      local_660[1] = -0.00021219444;
      afStack_658[0] = -0.00021219444;
      afStack_658[1] = -0.00021219444;
      afStack_650[0] = -0.00021219444;
      afStack_650[1] = -0.00021219444;
      afStack_648[0] = -0.00021219444;
      afStack_648[1] = -0.00021219444;
      local_dc0._0_8_ = auVar23._0_8_;
      local_680 = local_dc0._0_8_;
      local_dc0._8_8_ = auVar23._8_8_;
      uStack_678 = local_dc0._8_8_;
      uStack_670 = 0;
      uStack_668 = 0;
      auVar49._8_4_ = -0.00021219444;
      auVar49._12_4_ = -0.00021219444;
      auVar49._0_4_ = -0.00021219444;
      auVar49._4_4_ = -0.00021219444;
      auVar49._16_4_ = -0.00021219444;
      auVar49._20_4_ = -0.00021219444;
      auVar49._24_4_ = -0.00021219444;
      auVar49._28_4_ = -0.00021219444;
      auVar23 = vfnmadd213ps_fma(auVar49,local_e00,ZEXT1632(auVar23));
      auVar74 = ZEXT1632(auVar23);
      local_dc0._0_8_ = auVar23._0_8_;
      local_c00 = local_dc0._0_8_;
      local_dc0._8_8_ = auVar23._8_8_;
      uStack_bf8 = local_dc0._8_8_;
      uStack_bf0 = 0;
      uStack_be8 = 0;
      local_be0._0_4_ = auVar23._0_4_;
      local_be0._4_4_ = auVar23._4_4_;
      uStack_bd8._0_4_ = auVar23._8_4_;
      uStack_bd8._4_4_ = auVar23._12_4_;
      local_de0._4_4_ = local_be0._4_4_ * local_be0._4_4_;
      local_de0._0_4_ = (float)local_be0 * (float)local_be0;
      local_720 = local_de0;
      uStack_dd8._0_4_ = (float)uStack_bd8 * (float)uStack_bd8;
      uStack_dd8._4_4_ = uStack_bd8._4_4_ * uStack_bd8._4_4_;
      auVar18 = _local_de0;
      _local_de0 = ZEXT1632(_local_de0);
      auVar40 = _local_de0;
      uStack_e78._0_4_ = 0x39506967;
      local_e80 = (undefined1  [8])0x3950696739506967;
      uStack_e78._4_4_ = 0x39506967;
      uStack_e70._0_4_ = 0x39506967;
      uStack_e70._4_4_ = 0x39506967;
      auVar64 = _local_e80;
      uStack_e68._0_4_ = 0x39506967;
      uStack_e68._4_4_ = 0x39506967;
      auVar20 = _local_e80;
      local_b58 = local_e80;
      local_af0 = ::_ps256_cephes_exp_p1;
      local_8e0 = 0x3950696739506967;
      uStack_8d8 = uStack_e78;
      uStack_e70 = auVar64._16_8_;
      uStack_8d0 = uStack_e70;
      uStack_e68 = auVar20._24_8_;
      uStack_8c8 = uStack_e68;
      local_900 = local_dc0._0_8_;
      uStack_8f8 = local_dc0._8_8_;
      uStack_8f0 = 0;
      uStack_8e8 = 0;
      local_920[0] = 0.0013981999;
      local_920[1] = 0.0013981999;
      afStack_918[0] = 0.0013981999;
      afStack_918[1] = 0.0013981999;
      afStack_910[0] = 0.0013981999;
      afStack_910[1] = 0.0013981999;
      afStack_908[0] = 0.0013981999;
      afStack_908[1] = 0.0013981999;
      auVar43._8_4_ = 0.0013981999;
      auVar43._12_4_ = 0.0013981999;
      auVar43._0_4_ = 0.0013981999;
      auVar43._4_4_ = 0.0013981999;
      auVar43._16_4_ = 0.0013981999;
      auVar43._20_4_ = 0.0013981999;
      auVar43._24_4_ = 0.0013981999;
      auVar43._28_4_ = 0.0013981999;
      auVar23 = vfmadd213ps_fma(auVar74,auVar20,auVar43);
      local_b08 = ::_ps256_cephes_exp_p2;
      local_e80 = auVar23._0_8_;
      local_880 = local_e80;
      uStack_e78 = auVar23._8_8_;
      uStack_878 = uStack_e78;
      uStack_870 = 0;
      uStack_868 = 0;
      local_8a0 = local_dc0._0_8_;
      uStack_898 = local_dc0._8_8_;
      uStack_890 = 0;
      uStack_888 = 0;
      local_8c0[0] = 0.008333452;
      local_8c0[1] = 0.008333452;
      afStack_8b8[0] = 0.008333452;
      afStack_8b8[1] = 0.008333452;
      afStack_8b0[0] = 0.008333452;
      afStack_8b0[1] = 0.008333452;
      afStack_8a8[0] = 0.008333452;
      afStack_8a8[1] = 0.008333452;
      auVar44._8_4_ = 0.008333452;
      auVar44._12_4_ = 0.008333452;
      auVar44._0_4_ = 0.008333452;
      auVar44._4_4_ = 0.008333452;
      auVar44._16_4_ = 0.008333452;
      auVar44._20_4_ = 0.008333452;
      auVar44._24_4_ = 0.008333452;
      auVar44._28_4_ = 0.008333452;
      auVar23 = vfmadd213ps_fma(auVar74,ZEXT1632(auVar23),auVar44);
      local_b20 = ::_ps256_cephes_exp_p3;
      local_e80 = auVar23._0_8_;
      local_820 = local_e80;
      uStack_e78 = auVar23._8_8_;
      uStack_818 = uStack_e78;
      uStack_810 = 0;
      uStack_808 = 0;
      local_840 = local_dc0._0_8_;
      uStack_838 = local_dc0._8_8_;
      uStack_830 = 0;
      uStack_828 = 0;
      local_860[0] = 0.041665796;
      local_860[1] = 0.041665796;
      afStack_858[0] = 0.041665796;
      afStack_858[1] = 0.041665796;
      afStack_850[0] = 0.041665796;
      afStack_850[1] = 0.041665796;
      afStack_848[0] = 0.041665796;
      afStack_848[1] = 0.041665796;
      auVar45._8_4_ = 0.041665796;
      auVar45._12_4_ = 0.041665796;
      auVar45._0_4_ = 0.041665796;
      auVar45._4_4_ = 0.041665796;
      auVar45._16_4_ = 0.041665796;
      auVar45._20_4_ = 0.041665796;
      auVar45._24_4_ = 0.041665796;
      auVar45._28_4_ = 0.041665796;
      auVar23 = vfmadd213ps_fma(auVar74,ZEXT1632(auVar23),auVar45);
      local_b38 = ::_ps256_cephes_exp_p4;
      local_e80 = auVar23._0_8_;
      local_7c0 = local_e80;
      uStack_e78 = auVar23._8_8_;
      uStack_7b8 = uStack_e78;
      uStack_7b0 = 0;
      uStack_7a8 = 0;
      local_7e0 = local_dc0._0_8_;
      uStack_7d8 = local_dc0._8_8_;
      uStack_7d0 = 0;
      uStack_7c8 = 0;
      local_800[0] = 0.16666666;
      local_800[1] = 0.16666666;
      afStack_7f8[0] = 0.16666666;
      afStack_7f8[1] = 0.16666666;
      afStack_7f0[0] = 0.16666666;
      afStack_7f0[1] = 0.16666666;
      afStack_7e8[0] = 0.16666666;
      afStack_7e8[1] = 0.16666666;
      auVar46._8_4_ = 0.16666666;
      auVar46._12_4_ = 0.16666666;
      auVar46._0_4_ = 0.16666666;
      auVar46._4_4_ = 0.16666666;
      auVar46._16_4_ = 0.16666666;
      auVar46._20_4_ = 0.16666666;
      auVar46._24_4_ = 0.16666666;
      auVar46._28_4_ = 0.16666666;
      auVar23 = vfmadd213ps_fma(auVar74,ZEXT1632(auVar23),auVar46);
      local_b50 = ::_ps256_cephes_exp_p5;
      local_e80 = auVar23._0_8_;
      local_760 = local_e80;
      uStack_e78 = auVar23._8_8_;
      uStack_758 = uStack_e78;
      uStack_750 = 0;
      uStack_748 = 0;
      local_780 = local_dc0._0_8_;
      uStack_778 = local_dc0._8_8_;
      uStack_770 = 0;
      uStack_768 = 0;
      local_7a0[0] = 0.5;
      local_7a0[1] = 0.5;
      afStack_798[0] = 0.5;
      afStack_798[1] = 0.5;
      afStack_790[0] = 0.5;
      afStack_790[1] = 0.5;
      afStack_788[0] = 0.5;
      afStack_788[1] = 0.5;
      auVar47._8_4_ = 0.5;
      auVar47._12_4_ = 0.5;
      auVar47._0_4_ = 0.5;
      auVar47._4_4_ = 0.5;
      auVar47._16_4_ = 0.5;
      auVar47._20_4_ = 0.5;
      auVar47._24_4_ = 0.5;
      auVar47._28_4_ = 0.5;
      auVar23 = vfmadd213ps_fma(auVar74,ZEXT1632(auVar23),auVar47);
      local_b60 = local_de0;
      local_e80 = auVar23._0_8_;
      local_700 = local_e80;
      uStack_e78 = auVar23._8_8_;
      uStack_6f8 = uStack_e78;
      uStack_6f0 = 0;
      uStack_6e8 = 0;
      uStack_dd8 = auVar18._8_8_;
      uStack_718 = uStack_dd8;
      uStack_710 = 0;
      uStack_708 = 0;
      local_740 = local_dc0._0_8_;
      uStack_738 = local_dc0._8_8_;
      uStack_730 = 0;
      uStack_728 = 0;
      auVar23 = vfmadd213ps_fma(auVar40,ZEXT1632(auVar23),auVar74);
      local_e80 = auVar23._0_8_;
      uVar22 = local_e80;
      uStack_e78 = auVar23._8_8_;
      uVar24 = uStack_e78;
      uStack_c90 = 0;
      uStack_c88 = 0;
      local_cc0 = 0x3f8000003f800000;
      uStack_cb8 = 0x3f8000003f800000;
      uStack_cb0 = 0x3f8000003f800000;
      uStack_ca8 = 0x3f8000003f800000;
      local_ca0._0_4_ = auVar23._0_4_;
      local_ca0._4_4_ = auVar23._4_4_;
      uStack_c98._0_4_ = auVar23._8_4_;
      uStack_c98._4_4_ = auVar23._12_4_;
      local_e80._4_4_ = local_ca0._4_4_ + 1.0;
      local_e80._0_4_ = (float)local_ca0 + 1.0;
      uStack_e78._0_4_ = (float)uStack_c98 + 1.0;
      uStack_e78._4_4_ = uStack_c98._4_4_ + 1.0;
      uStack_e70._0_4_ = 0x3f800000;
      uStack_e70._4_4_ = 0x3f800000;
      auVar64 = _local_e80;
      uStack_e68._0_4_ = 0x3f800000;
      uStack_e68._4_4_ = 0x3f800000;
      auVar19 = _local_e80;
      local_a40._0_4_ = local_e00._0_4_;
      local_a40._4_4_ = local_e00._4_4_;
      uStack_a38._0_4_ = local_e00._8_4_;
      uStack_a38._4_4_ = local_e00._12_4_;
      uStack_a30._0_4_ = local_e00._16_4_;
      uStack_a30._4_4_ = local_e00._20_4_;
      uStack_a28._0_4_ = local_e00._24_4_;
      uStack_a28._4_4_ = local_e00._28_4_;
      local_e20._4_4_ = (int)local_a40._4_4_;
      local_e20._0_4_ = (int)(float)local_a40;
      local_e20._8_4_ = (int)(float)uStack_a38;
      local_e20._12_4_ = (int)uStack_a38._4_4_;
      local_e20._16_4_ = (int)(float)uStack_a30;
      local_e20._20_4_ = (int)uStack_a30._4_4_;
      auVar68 = local_e20._0_24_;
      local_e20._24_4_ = (int)(float)uStack_a28;
      local_e20._28_4_ = (int)uStack_a28._4_4_;
      auVar20 = local_e20;
      local_a00 = local_e20._0_8_;
      uStack_9f8 = local_e20._8_8_;
      local_e20._16_8_ = auVar68._16_8_;
      uStack_9f0 = local_e20._16_8_;
      local_e20._24_8_ = auVar20._24_8_;
      uStack_9e8 = local_e20._24_8_;
      local_a20 = 0x7f0000007f;
      uStack_a18 = 0x7f0000007f;
      uStack_a10 = 0x7f0000007f;
      uStack_a08 = 0x7f0000007f;
      local_600 = local_e20._0_8_;
      uStack_5f8 = local_e20._8_8_;
      uStack_5f0 = local_e20._16_8_;
      uStack_5e8 = local_e20._24_8_;
      local_620 = 0x7f0000007f;
      uStack_618 = 0x7f0000007f;
      uStack_610 = 0x7f0000007f;
      uStack_608 = 0x7f0000007f;
      auVar51._16_8_ = local_e20._16_8_;
      auVar51._0_16_ = local_e20._0_16_;
      auVar51._24_8_ = local_e20._24_8_;
      auVar50._8_8_ = 0x7f0000007f;
      auVar50._0_8_ = 0x7f0000007f;
      auVar50._16_8_ = 0x7f0000007f;
      auVar50._24_8_ = 0x7f0000007f;
      auVar20 = vpaddd_avx2(auVar51,auVar50);
      local_e20._0_8_ = auVar20._0_8_;
      local_9c0 = local_e20._0_8_;
      local_e20._8_8_ = auVar20._8_8_;
      uStack_9b8 = local_e20._8_8_;
      local_e20._16_8_ = auVar20._16_8_;
      uStack_9b0 = local_e20._16_8_;
      local_e20._24_8_ = auVar20._24_8_;
      uStack_9a8 = local_e20._24_8_;
      local_9c4 = 0x17;
      local_5c0 = local_e20._0_8_;
      uStack_5b8 = local_e20._8_8_;
      uStack_5b0 = local_e20._16_8_;
      uStack_5a8 = local_e20._24_8_;
      local_5c4 = 0x17;
      local_e20 = vpslld_avx2(auVar20,ZEXT416(0x17));
      local_9a0 = local_e20._0_8_;
      uStack_998 = local_e20._8_8_;
      uStack_990 = local_e20._16_8_;
      uStack_988 = local_e20._24_8_;
      local_ea0 = local_e20._0_8_;
      uStack_e98 = local_e20._8_8_;
      uStack_e90 = local_e20._16_8_;
      uStack_e88 = local_e20._24_8_;
      local_c20 = local_e80;
      uStack_c18 = uStack_e78;
      uStack_e70 = auVar64._16_8_;
      uStack_c10 = uStack_e70;
      uStack_e68 = auVar19._24_8_;
      uStack_c08 = uStack_e68;
      local_c40._0_4_ = local_e20._0_4_;
      local_c40._4_4_ = local_e20._4_4_;
      uStack_c38._0_4_ = local_e20._8_4_;
      uStack_c38._4_4_ = local_e20._12_4_;
      uStack_c30._0_4_ = local_e20._16_4_;
      uStack_c30._4_4_ = local_e20._20_4_;
      uStack_c28._0_4_ = local_e20._24_4_;
      local_e80._4_4_ = (local_ca0._4_4_ + 1.0) * local_c40._4_4_;
      local_e80._0_4_ = ((float)local_ca0 + 1.0) * (float)local_c40;
      uStack_e78._0_4_ = ((float)uStack_c98 + 1.0) * (float)uStack_c38;
      uStack_e78._4_4_ = (uStack_c98._4_4_ + 1.0) * uStack_c38._4_4_;
      uStack_e70._0_4_ = (float)uStack_c30 * 1.0;
      uStack_e70._4_4_ = uStack_c30._4_4_ * 1.0;
      auVar64 = _local_e80;
      uStack_e68._0_4_ = (float)uStack_c28 * 1.0;
      uStack_e68._4_4_ = 0x3f800000;
      auVar21 = _local_e80;
      local_ec0 = local_e80;
      uStack_eb8 = uStack_e78;
      uStack_e70 = auVar64._16_8_;
      uStack_eb0 = uStack_e70;
      uStack_e68 = auVar21._24_8_;
      uStack_ea8 = uStack_e68;
      local_2334 = 0x3f800000;
      local_1000 = 0x3f800000;
      auVar23 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3f800000),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3f800000),0x30);
      auVar18 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x30);
      auVar75._16_16_ = auVar23;
      auVar75._0_16_ = auVar18;
      local_1020._0_8_ = auVar18._0_8_;
      local_ee0 = local_1020._0_8_;
      local_1020._8_8_ = auVar18._8_8_;
      uStack_ed8 = local_1020._8_8_;
      local_1020._16_8_ = auVar23._0_8_;
      uStack_ed0 = local_1020._16_8_;
      local_1020._24_8_ = auVar23._8_8_;
      uStack_ec8 = local_1020._24_8_;
      auVar19._16_8_ = uStack_e70;
      auVar19._0_16_ = _local_e80;
      auVar19._24_8_ = uStack_e68;
      auVar20._16_8_ = local_1020._16_8_;
      auVar20._0_16_ = auVar18;
      auVar20._24_8_ = local_1020._24_8_;
      local_23c0 = vsubps_avx(auVar19,auVar20);
      local_ba0._0_4_ = auVar17._0_4_;
      local_ba0._4_4_ = auVar17._4_4_;
      uStack_b98._0_4_ = auVar17._8_4_;
      uStack_b98._4_4_ = auVar17._12_4_;
      uStack_b90._0_4_ = auVar16._0_4_;
      uStack_b90._4_4_ = auVar16._4_4_;
      uStack_b88._0_4_ = auVar16._8_4_;
      uStack_b88._4_4_ = auVar16._12_4_;
      fStack_c64 = uStack_b88._4_4_;
      local_bc0._0_4_ = local_23c0._0_4_;
      local_bc0._4_4_ = local_23c0._4_4_;
      uStack_bb8._0_4_ = local_23c0._8_4_;
      uStack_bb8._4_4_ = local_23c0._12_4_;
      uStack_bb0._0_4_ = local_23c0._16_4_;
      uStack_bb0._4_4_ = local_23c0._20_4_;
      uStack_ba8._0_4_ = local_23c0._24_4_;
      local_c80 = (float)local_ba0 * (float)local_bc0;
      fStack_c7c = local_ba0._4_4_ * local_bc0._4_4_;
      fStack_c78 = (float)uStack_b98 * (float)uStack_bb8;
      fStack_c74 = uStack_b98._4_4_ * uStack_bb8._4_4_;
      fStack_c70 = (float)uStack_b90 * (float)uStack_bb0;
      fStack_c6c = uStack_b90._4_4_ * uStack_bb0._4_4_;
      fStack_c68 = (float)uStack_b88 * (float)uStack_ba8;
      local_c60._0_4_ = local_23a0._0_4_;
      local_c60._4_4_ = local_23a0._4_4_;
      fStack_c58 = local_23a0._8_4_;
      fStack_c54 = local_23a0._12_4_;
      fStack_c50 = local_23a0._16_4_;
      fStack_c4c = local_23a0._20_4_;
      fStack_c48 = local_23a0._24_4_;
      fStack_c44 = local_23a0._28_4_;
      local_2400 = (float)local_c60._0_4_ + local_c80;
      fStack_23fc = (float)local_c60._4_4_ + fStack_c7c;
      fStack_23f8 = fStack_c58 + fStack_c78;
      fStack_23f4 = fStack_c54 + fStack_c74;
      fStack_23f0 = fStack_c50 + fStack_c70;
      fStack_23ec = fStack_c4c + fStack_c6c;
      fStack_23e8 = fStack_c48 + fStack_c68;
      fStack_23e4 = fStack_c44 + uStack_b88._4_4_;
      *(ulong *)*local_26f8 = CONCAT44(fStack_23fc,local_2400);
      *(ulong *)(*local_26f8 + 8) = CONCAT44(fStack_23f4,fStack_23f8);
      *(ulong *)(*local_26f8 + 0x10) = CONCAT44(fStack_23ec,fStack_23f0);
      *(ulong *)(*local_26f8 + 0x18) = CONCAT44(fStack_23e4,fStack_23e8);
      local_26f8 = (undefined1 (*) [64])(*local_26f8 + 0x20);
      local_1020 = auVar75;
      local_ffc = local_1000;
      local_ff8 = local_1000;
      local_ff4 = local_1000;
      local_ff0 = local_1000;
      local_fec = local_1000;
      local_fe8 = local_1000;
      local_fe4 = local_1000;
      local_fa0 = local_2360;
      uStack_f98 = uStack_2358;
      uStack_f90 = uStack_2350;
      uStack_f88 = uStack_2348;
      local_f20 = local_2360;
      uStack_f18 = uStack_2358;
      uStack_f10 = uStack_2350;
      uStack_f08 = uStack_2348;
      _local_e80 = auVar21;
      _local_de0 = auVar40;
      local_dc0 = auVar74;
      local_ca0 = uVar22;
      uStack_c98 = uVar24;
      _local_c60 = local_23a0;
      local_c40 = local_e20._0_8_;
      uStack_c38 = local_e20._8_8_;
      uStack_c30 = local_e20._16_8_;
      uStack_c28 = local_e20._24_8_;
      local_be0 = local_c00;
      uStack_bd8 = uStack_bf8;
      uStack_bd0 = uStack_bf0;
      uStack_bc8 = uStack_be8;
      local_bc0 = local_23c0._0_8_;
      uStack_bb8 = local_23c0._8_8_;
      uStack_bb0 = local_23c0._16_8_;
      uStack_ba8 = local_23c0._24_8_;
      local_ba0 = local_fe0._0_8_;
      uStack_b98 = local_fe0._8_8_;
      uStack_b90 = local_fe0._16_8_;
      uStack_b88 = local_fe0._24_8_;
      local_b48 = local_b68;
      local_b40 = local_b58;
      local_b30 = local_b68;
      local_b28 = local_b58;
      local_b18 = local_b68;
      local_b10 = local_b58;
      local_b00 = local_b68;
      local_af8 = local_b58;
      local_ae8 = local_b68;
      local_ae0 = local_b58;
      local_ac8 = local_b68;
      local_a70 = local_b68;
      local_a58 = local_b68;
      local_a48 = local_a60;
      local_a40 = local_e00._0_8_;
      uStack_a38 = local_e00._8_8_;
      uStack_a30 = local_e00._16_8_;
      uStack_a28 = local_e00._24_8_;
    }
    local_2330 = *(float *)(in_RDI + 0xd0);
    for (; fStack_232c = local_2330, fStack_2328 = local_2330, fStack_2324 = local_2330,
        local_231c = local_2330, local_2230 = local_2690, local_fe0 = auVar73,
        local_fc0 = local_240c, local_fbc = local_240c, local_fb8 = local_240c,
        local_fb4 = local_240c, local_fb0 = local_240c, local_fac = local_240c,
        local_fa8 = local_240c, local_fa4 = local_240c, local_2720 = local_2290,
        local_2750 + 3 < local_26e8; local_2750 = local_2750 + 4) {
      local_2318 = local_26f8;
      local_22c0 = *(undefined8 *)*local_26f8;
      uStack_22b8 = *(undefined8 *)(*local_26f8 + 8);
      local_22f8 = local_26f8;
      local_570 = (undefined1  [16])0x0;
      local_590 = 0;
      uStack_588 = 0;
      local_22e0 = vmaxps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_26f8);
      local_580 = (undefined1  [16])0x0;
      local_550 = 0;
      uStack_548 = 0;
      auVar16 = vminps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_26f8);
      local_22f0._0_8_ = auVar16._0_8_;
      local_22f0._8_8_ = auVar16._8_8_;
      local_480 = (undefined1  [16])0x0;
      local_4f0 = 0x3f800000;
      uStack_4ec = 0x3f800000;
      uStack_4e8 = 0x3f800000;
      uStack_4e4 = 0x3f800000;
      local_460 = local_22f0._0_8_;
      uStack_458 = local_22f0._8_8_;
      local_470 = 0x42b0c0a5;
      uStack_46c = 0x42b0c0a5;
      uStack_468 = 0x42b0c0a5;
      uStack_464 = 0x42b0c0a5;
      auVar18._8_4_ = 0x42b0c0a5;
      auVar18._0_8_ = 0x42b0c0a542b0c0a5;
      auVar18._12_4_ = 0x42b0c0a5;
      auVar16 = vminps_avx(auVar16,auVar18);
      local_4b0._0_8_ = auVar16._0_8_;
      local_490 = local_4b0._0_8_;
      local_4b0._8_8_ = auVar16._8_8_;
      uStack_488 = local_4b0._8_8_;
      local_4a0 = 0xc2b0c0a5;
      uStack_49c = 0xc2b0c0a5;
      uStack_498 = 0xc2b0c0a5;
      uStack_494 = 0xc2b0c0a5;
      auVar23._8_4_ = 0xc2b0c0a5;
      auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar23._12_4_ = 0xc2b0c0a5;
      auVar23 = vmaxps_avx(auVar16,auVar23);
      local_4b0._0_8_ = auVar23._0_8_;
      uVar22 = local_4b0._0_8_;
      local_4b0._8_8_ = auVar23._8_8_;
      uVar24 = local_4b0._8_8_;
      local_390 = 0x3fb8aa3b;
      uStack_38c = 0x3fb8aa3b;
      uStack_388 = 0x3fb8aa3b;
      uStack_384 = 0x3fb8aa3b;
      local_380._0_4_ = auVar23._0_4_;
      local_380._4_4_ = auVar23._4_4_;
      uStack_378._0_4_ = auVar23._8_4_;
      uStack_378._4_4_ = auVar23._12_4_;
      local_4d0._4_4_ = local_380._4_4_ * 1.442695;
      local_4d0._0_4_ = (float)local_380 * 1.442695;
      uStack_4c8._0_4_ = (float)uStack_378 * 1.442695;
      uStack_4c8._4_4_ = uStack_378._4_4_ * 1.442695;
      local_400 = local_4d0;
      uStack_3f8 = uStack_4c8;
      local_410 = 0x3f000000;
      uStack_40c = 0x3f000000;
      uStack_408 = 0x3f000000;
      uStack_404 = 0x3f000000;
      local_4d0._0_4_ = (float)local_380 * 1.442695 + 0.5;
      local_4d0._4_4_ = local_380._4_4_ * 1.442695 + 0.5;
      fVar76 = (float)uStack_378 * 1.442695 + 0.5;
      fVar77 = uStack_378._4_4_ * 1.442695 + 0.5;
      uStack_4c8._0_4_ = fVar76;
      uStack_4c8._4_4_ = fVar77;
      local_340 = local_4d0;
      uStack_338 = uStack_4c8;
      local_4e0._4_4_ = (int)(float)local_4d0._4_4_;
      local_4e0._0_4_ = (int)(float)local_4d0._0_4_;
      local_4e0._8_4_ = (int)fVar76;
      local_4e0._12_4_ = (int)fVar77;
      local_330 = local_4e0._0_8_;
      uStack_328 = local_4e0._8_8_;
      auVar52._8_8_ = local_4e0._8_8_;
      auVar52._0_8_ = local_4e0._0_8_;
      auVar17 = vcvtdq2ps_avx(auVar52);
      local_4c0 = auVar17._0_8_;
      local_310 = local_4c0;
      uStack_4b8 = auVar17._8_8_;
      uStack_308 = uStack_4b8;
      local_320 = local_4d0;
      uStack_318 = uStack_4c8;
      auVar53._8_8_ = uStack_4c8;
      auVar53._0_8_ = local_4d0;
      auVar16 = vcmpps_avx(auVar53,auVar17,1);
      local_500._0_8_ = auVar16._0_8_;
      local_2f0 = local_500._0_8_;
      local_500._8_8_ = auVar16._8_8_;
      uStack_2e8 = local_500._8_8_;
      local_300 = 0x3f8000003f800000;
      uStack_2f8 = 0x3f8000003f800000;
      auVar54._8_8_ = 0x3f8000003f800000;
      auVar54._0_8_ = 0x3f8000003f800000;
      local_500 = vpand_avx(auVar16,auVar54);
      local_440 = local_4c0;
      uStack_438 = uStack_4b8;
      local_450 = local_500._0_8_;
      uStack_448 = local_500._8_8_;
      _local_4d0 = vsubps_avx(auVar17,local_500);
      local_2d0 = local_4d0;
      local_2c0 = ::_ps_cephes_exp_C1;
      local_2e0 = local_4b0;
      local_1b0 = local_4d0;
      uStack_1a8 = uStack_4c8;
      local_1c0[0] = 0.6933594;
      local_1c0[1] = 0.6933594;
      afStack_1b8[0] = 0.6933594;
      afStack_1b8[1] = 0.6933594;
      local_1d0 = local_4b0._0_8_;
      uStack_1c8 = local_4b0._8_8_;
      auVar57._8_4_ = 0.6933594;
      auVar57._12_4_ = 0.6933594;
      auVar57._0_4_ = 0.6933594;
      auVar57._4_4_ = 0.6933594;
      auVar16 = vfnmadd213ps_fma(auVar57,_local_4d0,auVar23);
      local_2d8 = ::_ps_cephes_exp_C2;
      local_180 = local_4d0;
      uStack_178 = uStack_4c8;
      local_190[0] = -0.00021219444;
      local_190[1] = -0.00021219444;
      afStack_188[0] = -0.00021219444;
      afStack_188[1] = -0.00021219444;
      local_4b0._0_8_ = auVar16._0_8_;
      local_1a0 = local_4b0._0_8_;
      local_4b0._8_8_ = auVar16._8_8_;
      uStack_198 = local_4b0._8_8_;
      auVar58._8_4_ = -0.00021219444;
      auVar58._12_4_ = -0.00021219444;
      auVar58._0_4_ = -0.00021219444;
      auVar58._4_4_ = -0.00021219444;
      local_4b0 = vfnmadd213ps_fma(auVar58,_local_4d0,auVar16);
      local_3b0 = local_4b0._0_8_;
      uStack_3a8 = local_4b0._8_8_;
      local_3a0._0_4_ = local_4b0._0_4_;
      local_3a0._4_4_ = local_4b0._4_4_;
      uStack_398._0_4_ = local_4b0._8_4_;
      uStack_398._4_4_ = local_4b0._12_4_;
      local_4c0._4_4_ = local_3a0._4_4_ * local_3a0._4_4_;
      local_4c0._0_4_ = (float)local_3a0 * (float)local_3a0;
      uStack_4b8._0_4_ = (float)uStack_398 * (float)uStack_398;
      uStack_4b8._4_4_ = uStack_398._4_4_ * uStack_398._4_4_;
      uStack_508._0_4_ = 0x39506967;
      local_510 = (undefined1  [8])0x3950696739506967;
      uStack_508._4_4_ = 0x39506967;
      local_2a0 = local_510;
      local_238 = ::_ps_cephes_exp_p1;
      local_150 = 0x3950696739506967;
      uStack_148 = uStack_508;
      local_160 = local_4b0._0_8_;
      uStack_158 = local_4b0._8_8_;
      local_170[0] = 0.0013981999;
      local_170[1] = 0.0013981999;
      afStack_168[0] = 0.0013981999;
      afStack_168[1] = 0.0013981999;
      auVar59._8_4_ = 0.0013981999;
      auVar59._12_4_ = 0.0013981999;
      auVar59._0_4_ = 0.0013981999;
      auVar59._4_4_ = 0.0013981999;
      auVar16 = vfmadd213ps_fma(local_4b0,_local_510,auVar59);
      local_250 = ::_ps_cephes_exp_p2;
      local_510 = auVar16._0_8_;
      local_120 = local_510;
      uStack_508 = auVar16._8_8_;
      uStack_118 = uStack_508;
      local_130 = local_4b0._0_8_;
      uStack_128 = local_4b0._8_8_;
      local_140[0] = 0.008333452;
      local_140[1] = 0.008333452;
      afStack_138[0] = 0.008333452;
      afStack_138[1] = 0.008333452;
      auVar60._8_4_ = 0.008333452;
      auVar60._12_4_ = 0.008333452;
      auVar60._0_4_ = 0.008333452;
      auVar60._4_4_ = 0.008333452;
      auVar16 = vfmadd213ps_fma(local_4b0,auVar16,auVar60);
      local_268 = ::_ps_cephes_exp_p3;
      local_510 = auVar16._0_8_;
      local_f0 = local_510;
      uStack_508 = auVar16._8_8_;
      uStack_e8 = uStack_508;
      local_100 = local_4b0._0_8_;
      uStack_f8 = local_4b0._8_8_;
      local_110[0] = 0.041665796;
      local_110[1] = 0.041665796;
      afStack_108[0] = 0.041665796;
      afStack_108[1] = 0.041665796;
      auVar61._8_4_ = 0.041665796;
      auVar61._12_4_ = 0.041665796;
      auVar61._0_4_ = 0.041665796;
      auVar61._4_4_ = 0.041665796;
      auVar16 = vfmadd213ps_fma(local_4b0,auVar16,auVar61);
      local_280 = ::_ps_cephes_exp_p4;
      local_510 = auVar16._0_8_;
      local_c0 = local_510;
      uStack_508 = auVar16._8_8_;
      uStack_b8 = uStack_508;
      local_d0 = local_4b0._0_8_;
      uStack_c8 = local_4b0._8_8_;
      local_e0[0] = 0.16666666;
      local_e0[1] = 0.16666666;
      afStack_d8[0] = 0.16666666;
      afStack_d8[1] = 0.16666666;
      auVar62._8_4_ = 0.16666666;
      auVar62._12_4_ = 0.16666666;
      auVar62._0_4_ = 0.16666666;
      auVar62._4_4_ = 0.16666666;
      auVar16 = vfmadd213ps_fma(local_4b0,auVar16,auVar62);
      local_298 = ::_ps_cephes_exp_p5;
      local_510 = auVar16._0_8_;
      local_90 = local_510;
      uStack_508 = auVar16._8_8_;
      uStack_88 = uStack_508;
      local_a0 = local_4b0._0_8_;
      uStack_98 = local_4b0._8_8_;
      local_b0[0] = 0.5;
      local_b0[1] = 0.5;
      afStack_a8[0] = 0.5;
      afStack_a8[1] = 0.5;
      auVar63._8_4_ = 0.5;
      auVar63._12_4_ = 0.5;
      auVar63._0_4_ = 0.5;
      auVar63._4_4_ = 0.5;
      auVar16 = vfmadd213ps_fma(local_4b0,auVar16,auVar63);
      local_2a8 = local_4c0;
      local_510 = auVar16._0_8_;
      local_60 = local_510;
      uStack_508 = auVar16._8_8_;
      uStack_58 = uStack_508;
      local_70 = local_4c0;
      uStack_68 = uStack_4b8;
      local_80 = local_4b0._0_8_;
      uStack_78 = local_4b0._8_8_;
      auVar16 = vfmadd213ps_fma(_local_4c0,auVar16,local_4b0);
      local_510 = auVar16._0_8_;
      uVar25 = local_510;
      uStack_508 = auVar16._8_8_;
      uVar26 = uStack_508;
      local_430 = 0x3f8000003f800000;
      uStack_428 = 0x3f8000003f800000;
      local_420._0_4_ = auVar16._0_4_;
      local_420._4_4_ = auVar16._4_4_;
      uStack_418._0_4_ = auVar16._8_4_;
      uStack_418._4_4_ = auVar16._12_4_;
      local_510._4_4_ = local_420._4_4_ + 1.0;
      local_510._0_4_ = (float)local_420 + 1.0;
      uStack_508._0_4_ = (float)uStack_418 + 1.0;
      uStack_508._4_4_ = uStack_418._4_4_ + 1.0;
      local_350._0_4_ = local_4d0._0_4_;
      local_350._4_4_ = local_4d0._4_4_;
      uStack_348._0_4_ = local_4d0._8_4_;
      uStack_348._4_4_ = local_4d0._12_4_;
      local_4e0._4_4_ = (int)local_350._4_4_;
      local_4e0._0_4_ = (int)(float)local_350;
      local_4e0._8_4_ = (int)(float)uStack_348;
      local_4e0._12_4_ = (int)uStack_348._4_4_;
      local_210 = local_4e0._0_8_;
      uStack_208 = local_4e0._8_8_;
      local_220 = 0x7f0000007f;
      uStack_218 = 0x7f0000007f;
      auVar56._8_8_ = local_4e0._8_8_;
      auVar56._0_8_ = local_4e0._0_8_;
      auVar55._8_8_ = 0x7f0000007f;
      auVar55._0_8_ = 0x7f0000007f;
      auVar16 = vpaddd_avx(auVar56,auVar55);
      local_4e0._0_8_ = auVar16._0_8_;
      local_1f0 = local_4e0._0_8_;
      local_4e0._8_8_ = auVar16._8_8_;
      uStack_1e8 = local_4e0._8_8_;
      local_1f4 = 0x17;
      local_4e0 = vpslld_avx(auVar16,ZEXT416(0x17));
      local_1e0 = local_4e0._0_8_;
      uStack_1d8 = local_4e0._8_8_;
      local_520 = local_4e0._0_8_;
      uStack_518 = local_4e0._8_8_;
      local_3c0 = local_510;
      uStack_3b8 = uStack_508;
      local_3d0._0_4_ = local_4e0._0_4_;
      local_3d0._4_4_ = local_4e0._4_4_;
      uStack_3c8._0_4_ = local_4e0._8_4_;
      uStack_3c8._4_4_ = local_4e0._12_4_;
      local_510._4_4_ = (local_420._4_4_ + 1.0) * local_3d0._4_4_;
      local_510._0_4_ = ((float)local_420 + 1.0) * (float)local_3d0;
      uStack_508._0_4_ = ((float)uStack_418 + 1.0) * (float)uStack_3c8;
      uStack_508._4_4_ = (uStack_418._4_4_ + 1.0) * uStack_3c8._4_4_;
      local_530 = local_510;
      uStack_528 = uStack_508;
      local_2294 = 0x3f800000;
      local_22b0 = 0x3f800000;
      local_540 = 0x3f8000003f800000;
      uStack_538 = 0x3f8000003f800000;
      auVar17._8_8_ = uStack_508;
      auVar17._0_8_ = local_510;
      auVar16._8_8_ = 0x3f8000003f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      local_22f0 = vsubps_avx(auVar17,auVar16);
      local_370._0_4_ = local_22f0._0_4_;
      local_370._4_4_ = local_22f0._4_4_;
      uStack_368._0_4_ = local_22f0._8_4_;
      uStack_368._4_4_ = local_22f0._12_4_;
      local_3f0 = local_2330 * (float)local_370;
      fStack_3ec = local_2330 * local_370._4_4_;
      fStack_3e8 = local_2330 * (float)uStack_368;
      fStack_3e4 = local_2330 * uStack_368._4_4_;
      local_3e0._0_4_ = local_22e0._0_4_;
      local_3e0._4_4_ = local_22e0._4_4_;
      fStack_3d8 = local_22e0._8_4_;
      fStack_3d4 = local_22e0._12_4_;
      local_2310 = (float)local_3e0._0_4_ + local_3f0;
      fStack_230c = (float)local_3e0._4_4_ + fStack_3ec;
      fStack_2308 = fStack_3d8 + fStack_3e8;
      fStack_2304 = fStack_3d4 + fStack_3e4;
      *(ulong *)*local_26f8 = CONCAT44(fStack_230c,local_2310);
      *(ulong *)(*local_26f8 + 8) = CONCAT44(fStack_2304,fStack_2308);
      local_26f8 = (undefined1 (*) [64])(*local_26f8 + 0x10);
      local_22d0 = CONCAT44(local_2330,local_2330);
      uStack_22c8 = CONCAT44(local_2330,local_2330);
      uStack_22ac = local_22b0;
      uStack_22a8 = local_22b0;
      uStack_22a4 = local_22b0;
      local_5a0 = local_22c0;
      uStack_598 = uStack_22b8;
      local_560 = local_22c0;
      uStack_558 = uStack_22b8;
      local_420 = uVar25;
      uStack_418 = uVar26;
      _local_3e0 = local_22e0;
      local_3d0 = local_4e0._0_8_;
      uStack_3c8 = local_4e0._8_8_;
      local_3a0 = local_3b0;
      uStack_398 = uStack_3a8;
      local_380 = uVar22;
      uStack_378 = uVar24;
      local_370 = local_22f0._0_8_;
      uStack_368 = local_22f0._8_8_;
      local_360 = CONCAT44(local_2330,local_2330);
      uStack_358 = CONCAT44(local_2330,local_2330);
      local_350 = local_4d0;
      uStack_348 = uStack_4c8;
      local_2c8 = local_2e0;
      local_2b8 = local_2d0;
      local_2b0 = local_2e0;
      local_290 = local_2e0;
      local_288 = local_2a0;
      local_278 = local_2e0;
      local_270 = local_2a0;
      local_260 = local_2e0;
      local_258 = local_2a0;
      local_248 = local_2e0;
      local_240 = local_2a0;
      local_230 = local_2e0;
      local_228 = local_2a0;
    }
    for (; local_2750 < local_26e8; local_2750 = local_2750 + 1) {
      if (*(float *)*local_26f8 < 0.0) {
        fVar76 = *(float *)(in_RDI + 0xd0);
        fVar77 = expf(*(float *)*local_26f8);
        *(float *)*local_26f8 = fVar76 * (fVar77 - 1.0);
      }
      local_26f8 = (undefined1 (*) [64])(*local_26f8 + 4);
    }
  }
  return 0;
}

Assistant:

int ELU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}